

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::BVHNIntersector1<4,_1,_true,_embree::sse2::SubGridIntersector1Pluecker<4,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  ulong uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  RTCIntersectArguments *pRVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  byte bVar18;
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  unkbyte10 Var27;
  undefined1 auVar28 [12];
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 (*pauVar32) [16];
  undefined4 uVar33;
  undefined4 uVar34;
  long lVar35;
  Scene *pSVar36;
  RayHit *pRVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  RTCRayQueryContext *pRVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  byte bVar63;
  char cVar64;
  float fVar65;
  byte bVar93;
  byte bVar95;
  char cVar98;
  char cVar99;
  char cVar100;
  byte bVar102;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  char cVar94;
  char cVar96;
  char cVar97;
  undefined1 auVar72 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  float fVar103;
  float fVar104;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  float fVar136;
  float fVar137;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar138;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar139;
  float fVar157;
  float fVar158;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar159;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar175;
  float fVar176;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar177;
  float fVar184;
  float fVar185;
  undefined1 auVar178 [16];
  float fVar186;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vint<4> sy;
  vfloat<4> tNear;
  vint<4> sx;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_148d;
  undefined1 local_148c [4];
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  undefined1 local_1478 [8];
  float fStack_1470;
  float fStack_146c;
  RayQueryContext *local_1468;
  ulong local_1460;
  undefined1 local_1458 [16];
  float local_1448;
  float fStack_1444;
  uint auStack_1440 [1];
  uint auStack_143c [1];
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  undefined1 local_1418 [8];
  float fStack_1410;
  float fStack_140c;
  undefined1 local_1408 [16];
  RTCFilterFunctionNArguments local_13f8;
  undefined8 local_13c8;
  float fStack_13c0;
  float fStack_13bc;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  undefined8 local_13a8;
  float fStack_13a0;
  float fStack_139c;
  float local_1398;
  float local_1394;
  float local_1390;
  undefined4 local_138c;
  undefined4 local_1388;
  undefined4 local_1384;
  undefined4 local_1380;
  uint local_137c;
  uint local_1378;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  undefined8 local_1358;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  undefined1 local_1318 [8];
  float fStack_1310;
  float fStack_130c;
  undefined1 local_1308 [8];
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  undefined8 local_12e8;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [16];
  undefined1 *local_1288;
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  float local_1238 [4];
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  float local_1218 [4];
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [16];
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 (*local_11c0) [16];
  ulong local_11b8;
  ulong local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  long local_1188;
  long local_1180;
  ulong local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  long local_1150;
  ulong local_1148;
  ulong local_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  uint local_1118;
  uint uStack_1114;
  uint uStack_1110;
  uint uStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar73 [16];
  undefined1 auVar66 [11];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar67 [12];
  undefined1 auVar75 [16];
  undefined1 auVar68 [13];
  undefined1 auVar76 [16];
  undefined1 auVar81 [16];
  undefined1 auVar78 [16];
  undefined1 auVar77 [16];
  undefined2 uVar101;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_11c0 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar160 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar166 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar199 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar167 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar8 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar228 = (ray->super_RayK<1>).tfar;
    fVar65 = 0.0;
    if (0.0 <= fVar228) {
      fVar65 = fVar228;
    }
    uVar49 = -(uint)(1e-18 <= ABS(aVar8.x));
    uVar51 = -(uint)(1e-18 <= ABS(aVar8.y));
    uVar55 = -(uint)(1e-18 <= ABS(aVar8.z));
    uVar59 = -(uint)(1e-18 <= ABS(aVar8.field_3.w));
    auVar140 = divps(_DAT_01f7ba10,(undefined1  [16])aVar8);
    auVar105._0_4_ = auVar140._0_4_ & uVar49;
    auVar105._4_4_ = auVar140._4_4_ & uVar51;
    auVar105._8_4_ = auVar140._8_4_ & uVar55;
    auVar105._12_4_ = auVar140._12_4_ & uVar59;
    auVar140._0_8_ = CONCAT44(~uVar51,~uVar49) & 0x5d5e0b6b5d5e0b6b;
    auVar140._8_4_ = ~uVar55 & 0x5d5e0b6b;
    auVar140._12_4_ = ~uVar59 & 0x5d5e0b6b;
    auVar140 = auVar140 | auVar105;
    fVar168 = auVar140._0_4_ * 0.99999964;
    fVar175 = auVar140._4_4_ * 0.99999964;
    fVar176 = auVar140._8_4_ * 0.99999964;
    fVar197 = auVar140._0_4_ * 1.0000004;
    fVar203 = auVar140._4_4_ * 1.0000004;
    fVar205 = auVar140._8_4_ * 1.0000004;
    fVar228 = 0.0;
    if (0.0 <= fVar167) {
      fVar228 = fVar167;
    }
    uVar44 = (ulong)(fVar168 < 0.0) << 4;
    uVar40 = (ulong)(fVar175 < 0.0) << 4 | 0x20;
    uVar45 = (ulong)(fVar176 < 0.0) << 4 | 0x40;
    uVar46 = uVar44 ^ 0x10;
    uVar41 = uVar40 ^ 0x10;
    auVar172._4_4_ = fVar228;
    auVar172._0_4_ = fVar228;
    auVar172._8_4_ = fVar228;
    auVar172._12_4_ = fVar228;
    auVar194._4_4_ = fVar65;
    auVar194._0_4_ = fVar65;
    auVar194._8_4_ = fVar65;
    auVar194._12_4_ = fVar65;
    local_1190 = (ulong)(((uint)(fVar168 < 0.0) << 4) >> 2);
    local_1198 = uVar46 >> 2;
    local_11a0 = uVar40 >> 2;
    local_11a8 = uVar41 >> 2;
    local_11b0 = uVar45 >> 2;
    local_1140 = uVar45 ^ 0x10;
    local_11b8 = (uVar45 ^ 0x10) >> 2;
    _local_1118 = mm_lookupmask_ps._240_8_;
    _uStack_1110 = mm_lookupmask_ps._248_8_;
    local_1468 = context;
    local_1208 = fVar199;
    fStack_1204 = fVar199;
    fStack_1200 = fVar199;
    fStack_11fc = fVar199;
    local_10c8 = fVar166;
    fStack_10c4 = fVar166;
    fStack_10c0 = fVar166;
    fStack_10bc = fVar166;
    local_1158 = uVar44;
    local_1368 = fVar203;
    fStack_1364 = fVar203;
    fStack_1360 = fVar203;
    fStack_135c = fVar203;
    local_1160 = uVar40;
    local_1168 = uVar45;
    local_1170 = uVar46;
    local_1178 = uVar41;
    local_10a8 = fVar205;
    fStack_10a4 = fVar205;
    fStack_10a0 = fVar205;
    fStack_109c = fVar205;
    local_1128 = auVar172;
    local_1138 = fVar176;
    fStack_1134 = fVar176;
    fStack_1130 = fVar176;
    fStack_112c = fVar176;
    local_10b8 = fVar160;
    fStack_10b4 = fVar160;
    fStack_10b0 = fVar160;
    fStack_10ac = fVar160;
    local_10d8 = fVar168;
    fStack_10d4 = fVar168;
    fStack_10d0 = fVar168;
    fStack_10cc = fVar168;
    local_10e8 = fVar175;
    fStack_10e4 = fVar175;
    fStack_10e0 = fVar175;
    fStack_10dc = fVar175;
    local_10f8 = fVar197;
    fStack_10f4 = fVar197;
    fStack_10f0 = fVar197;
    fStack_10ec = fVar197;
    fVar228 = fVar203;
    fVar65 = fVar203;
    fVar167 = fVar203;
    fVar231 = fVar199;
    fVar103 = fVar199;
    fVar104 = fVar199;
    fVar208 = fVar175;
    fVar207 = fVar175;
    fVar204 = fVar175;
    fVar198 = fVar197;
    fVar193 = fVar197;
    fVar192 = fVar197;
    fVar191 = fVar205;
    fVar187 = fVar205;
    fVar186 = fVar205;
    fVar185 = fVar176;
    fVar184 = fVar176;
    fVar177 = fVar176;
    fVar159 = fVar168;
    fVar158 = fVar168;
    fVar157 = fVar168;
    fVar139 = fVar166;
    fVar138 = fVar166;
    fVar137 = fVar166;
    fVar136 = fVar160;
    fVar119 = fVar160;
    fVar232 = fVar160;
LAB_00d294c3:
    do {
      pauVar32 = local_11c0 + -1;
      local_11c0 = local_11c0 + -1;
      pfVar6 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar32 + 8) < *pfVar6 || *(float *)((long)*pauVar32 + 8) == *pfVar6) {
        uVar48 = *(ulong *)*local_11c0;
        while ((uVar48 & 8) == 0) {
          pfVar6 = (float *)(uVar48 + 0x20 + uVar44);
          auVar121._0_4_ = (*pfVar6 - fVar232) * fVar157;
          auVar121._4_4_ = (pfVar6[1] - fVar119) * fVar158;
          auVar121._8_4_ = (pfVar6[2] - fVar136) * fVar159;
          auVar121._12_4_ = (pfVar6[3] - fVar160) * fVar168;
          pfVar6 = (float *)(uVar48 + 0x20 + uVar40);
          auVar162._0_4_ = (*pfVar6 - fVar137) * fVar204;
          auVar162._4_4_ = (pfVar6[1] - fVar138) * fVar207;
          auVar162._8_4_ = (pfVar6[2] - fVar139) * fVar208;
          auVar162._12_4_ = (pfVar6[3] - fVar166) * fVar175;
          auVar140 = maxps(auVar121,auVar162);
          pfVar6 = (float *)(uVar48 + 0x20 + uVar45);
          auVar170._0_4_ = (*pfVar6 - fVar199) * fVar177;
          auVar170._4_4_ = (pfVar6[1] - fVar231) * fVar184;
          auVar170._8_4_ = (pfVar6[2] - fVar103) * fVar185;
          auVar170._12_4_ = (pfVar6[3] - fVar104) * fVar176;
          pfVar6 = (float *)(uVar48 + 0x20 + uVar46);
          auVar120._0_4_ = (*pfVar6 - fVar232) * fVar192;
          auVar120._4_4_ = (pfVar6[1] - fVar119) * fVar193;
          auVar120._8_4_ = (pfVar6[2] - fVar136) * fVar198;
          auVar120._12_4_ = (pfVar6[3] - fVar160) * fVar197;
          pfVar6 = (float *)(uVar48 + 0x20 + uVar41);
          auVar141._0_4_ = (*pfVar6 - fVar137) * fVar203;
          auVar141._4_4_ = (pfVar6[1] - fVar138) * fVar228;
          auVar141._8_4_ = (pfVar6[2] - fVar139) * fVar65;
          auVar141._12_4_ = (pfVar6[3] - fVar166) * fVar167;
          auVar121 = minps(auVar120,auVar141);
          pfVar6 = (float *)(uVar48 + 0x20 + local_1140);
          auVar142._0_4_ = (*pfVar6 - fVar199) * fVar186;
          auVar142._4_4_ = (pfVar6[1] - fVar231) * fVar187;
          auVar142._8_4_ = (pfVar6[2] - fVar103) * fVar191;
          auVar142._12_4_ = (pfVar6[3] - fVar104) * fVar205;
          auVar105 = maxps(auVar170,auVar172);
          _local_12b8 = maxps(auVar140,auVar105);
          auVar140 = minps(auVar142,auVar194);
          auVar140 = minps(auVar121,auVar140);
          auVar146._4_4_ = -(uint)(local_12b8._4_4_ <= auVar140._4_4_);
          auVar146._0_4_ = -(uint)(local_12b8._0_4_ <= auVar140._0_4_);
          auVar146._8_4_ = -(uint)(local_12b8._8_4_ <= auVar140._8_4_);
          auVar146._12_4_ = -(uint)(local_12b8._12_4_ <= auVar140._12_4_);
          uVar49 = movmskps((int)local_1140,auVar146);
          if (uVar49 == 0) {
            if (local_11c0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d294c3;
          }
          uVar49 = uVar49 & 0xff;
          uVar39 = uVar48 & 0xfffffffffffffff0;
          lVar35 = 0;
          if (uVar49 != 0) {
            for (; (uVar49 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar48 = *(ulong *)(uVar39 + lVar35 * 8);
          uVar49 = uVar49 - 1 & uVar49;
          if (uVar49 != 0) {
            uVar51 = *(uint *)(local_12b8 + lVar35 * 4);
            lVar35 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar39 + lVar35 * 8);
            uVar55 = *(uint *)(local_12b8 + lVar35 * 4);
            uVar49 = uVar49 - 1 & uVar49;
            if (uVar49 == 0) {
              if (uVar51 < uVar55) {
                *(ulong *)*local_11c0 = uVar9;
                *(uint *)((long)*local_11c0 + 8) = uVar55;
                local_11c0 = local_11c0 + 1;
              }
              else {
                *(ulong *)*local_11c0 = uVar48;
                *(uint *)((long)*local_11c0 + 8) = uVar51;
                local_11c0 = local_11c0 + 1;
                uVar48 = uVar9;
              }
            }
            else {
              auVar69._8_4_ = uVar51;
              auVar69._0_8_ = uVar48;
              auVar69._12_4_ = 0;
              auVar106._8_4_ = uVar55;
              auVar106._0_8_ = uVar9;
              auVar106._12_4_ = 0;
              lVar35 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              uVar48 = *(ulong *)(uVar39 + lVar35 * 8);
              iVar38 = *(int *)(local_12b8 + lVar35 * 4);
              auVar122._8_4_ = iVar38;
              auVar122._0_8_ = uVar48;
              auVar122._12_4_ = 0;
              auVar143._8_4_ = -(uint)((int)uVar51 < (int)uVar55);
              uVar49 = uVar49 - 1 & uVar49;
              fVar203 = local_1368;
              fVar228 = fStack_1364;
              fVar65 = fStack_1360;
              fVar167 = fStack_135c;
              if (uVar49 == 0) {
                auVar143._4_4_ = auVar143._8_4_;
                auVar143._0_4_ = auVar143._8_4_;
                auVar143._12_4_ = auVar143._8_4_;
                auVar140 = auVar69 & auVar143 | ~auVar143 & auVar106;
                auVar105 = auVar106 & auVar143 | ~auVar143 & auVar69;
                auVar144._8_4_ = -(uint)(auVar140._8_4_ < iVar38);
                auVar144._0_8_ = CONCAT44(auVar144._8_4_,auVar144._8_4_);
                auVar144._12_4_ = auVar144._8_4_;
                auVar121 = auVar122 & auVar144 | ~auVar144 & auVar140;
                auVar70._8_4_ = -(uint)(auVar105._8_4_ < auVar121._8_4_);
                auVar70._4_4_ = auVar70._8_4_;
                auVar70._0_4_ = auVar70._8_4_;
                auVar70._12_4_ = auVar70._8_4_;
                *local_11c0 = ~auVar70 & auVar105 | auVar121 & auVar70;
                local_11c0[1] = auVar105 & auVar70 | ~auVar70 & auVar121;
                local_11c0 = local_11c0 + 2;
                uVar48 = ~auVar144._0_8_ & uVar48 | auVar140._0_8_ & auVar144._0_8_;
              }
              else {
                lVar35 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                uVar49 = *(uint *)(local_12b8 + lVar35 * 4);
                local_1458 = ZEXT416(uVar49);
                auVar161._8_4_ = uVar49;
                auVar161._0_8_ = *(undefined8 *)(uVar39 + lVar35 * 8);
                auVar161._12_4_ = 0;
                auVar145._4_4_ = auVar143._8_4_;
                auVar145._0_4_ = auVar143._8_4_;
                auVar145._8_4_ = auVar143._8_4_;
                auVar145._12_4_ = auVar143._8_4_;
                auVar140 = auVar69 & auVar145 | ~auVar145 & auVar106;
                auVar105 = auVar106 & auVar145 | ~auVar145 & auVar69;
                auVar169._0_4_ = -(uint)(iVar38 < (int)uVar49);
                auVar169._4_4_ = -(uint)(iVar38 < (int)uVar49);
                auVar169._8_4_ = -(uint)(iVar38 < (int)uVar49);
                auVar169._12_4_ = -(uint)(iVar38 < (int)uVar49);
                auVar146 = auVar122 & auVar169 | ~auVar169 & auVar161;
                auVar170 = ~auVar169 & auVar122 | auVar161 & auVar169;
                auVar123._8_4_ = -(uint)(auVar105._8_4_ < auVar170._8_4_);
                auVar123._4_4_ = auVar123._8_4_;
                auVar123._0_4_ = auVar123._8_4_;
                auVar123._12_4_ = auVar123._8_4_;
                auVar162 = auVar105 & auVar123 | ~auVar123 & auVar170;
                auVar107._8_4_ = -(uint)(auVar140._8_4_ < auVar146._8_4_);
                auVar107._0_8_ = CONCAT44(auVar107._8_4_,auVar107._8_4_);
                auVar107._12_4_ = auVar107._8_4_;
                auVar121 = ~auVar107 & auVar140 | auVar146 & auVar107;
                auVar71._8_4_ = -(uint)(auVar121._8_4_ < auVar162._8_4_);
                auVar71._4_4_ = auVar71._8_4_;
                auVar71._0_4_ = auVar71._8_4_;
                auVar71._12_4_ = auVar71._8_4_;
                *local_11c0 = ~auVar123 & auVar105 | auVar170 & auVar123;
                local_11c0[1] = ~auVar71 & auVar121 | auVar162 & auVar71;
                local_11c0[2] = auVar121 & auVar71 | ~auVar71 & auVar162;
                local_11c0 = local_11c0 + 3;
                uVar48 = auVar140._0_8_ & auVar107._0_8_ | ~auVar107._0_8_ & auVar146._0_8_;
                fVar199 = local_1208;
                fVar231 = fStack_1204;
                fVar103 = fStack_1200;
                fVar104 = fStack_11fc;
              }
            }
          }
        }
        local_1188 = (ulong)((uint)uVar48 & 0xf) - 8;
        if (local_1188 != 0) {
          uVar48 = uVar48 & 0xfffffffffffffff0;
          local_1180 = 0;
          local_1048 = auVar194;
          do {
            lVar35 = local_1180 * 0x58;
            local_1150 = uVar48 + lVar35;
            uVar7 = *(undefined8 *)(uVar48 + 0x20 + lVar35);
            uVar34 = *(undefined4 *)(uVar48 + 0x24 + lVar35);
            bVar102 = (byte)uVar7;
            bVar63 = (byte)uVar34;
            bVar14 = (byte)((ulong)uVar7 >> 8);
            bVar93 = (byte)((uint)uVar34 >> 8);
            bVar15 = (byte)((ulong)uVar7 >> 0x10);
            bVar95 = (byte)((uint)uVar34 >> 0x10);
            bVar18 = (byte)((uint)uVar34 >> 0x18);
            bVar16 = (byte)((ulong)uVar7 >> 0x18);
            cVar64 = -((byte)((bVar102 < bVar63) * bVar102 | (bVar102 >= bVar63) * bVar63) ==
                      bVar102);
            cVar94 = -((byte)((bVar14 < bVar93) * bVar14 | (bVar14 >= bVar93) * bVar93) == bVar14);
            cVar96 = -((byte)((bVar15 < bVar95) * bVar15 | (bVar15 >= bVar95) * bVar95) == bVar15);
            cVar97 = -((byte)((bVar16 < bVar18) * bVar16 | (bVar16 >= bVar18) * bVar18) == bVar16);
            cVar98 = -((char)((ulong)uVar7 >> 0x20) == '\0');
            cVar99 = -((char)((ulong)uVar7 >> 0x28) == '\0');
            cVar100 = -((char)((ulong)uVar7 >> 0x30) == '\0');
            bVar102 = -((char)((ulong)uVar7 >> 0x38) == '\0');
            auVar73._0_9_ = CONCAT18(0xff,(ulong)bVar102 << 0x38);
            auVar66._0_10_ = CONCAT19(0xff,auVar73._0_9_);
            auVar66[10] = 0xff;
            auVar67[0xb] = 0xff;
            auVar67._0_11_ = auVar66;
            auVar68[0xc] = 0xff;
            auVar68._0_12_ = auVar67;
            auVar78[0xd] = 0xff;
            auVar78._0_13_ = auVar68;
            fVar228 = *(float *)(uVar48 + 0x38 + lVar35);
            fVar65 = *(float *)(uVar48 + 0x3c + lVar35);
            fVar199 = *(float *)(uVar48 + 0x44 + lVar35);
            uVar49 = *(uint *)(local_1190 + 0x20 + local_1150);
            auVar24[0xc] = (char)(uVar49 >> 0x18);
            auVar24._0_12_ = ZEXT712(0);
            uVar51 = *(uint *)(local_1198 + 0x20 + local_1150);
            auVar19[0xc] = (char)(uVar51 >> 0x18);
            auVar19._0_12_ = ZEXT712(0);
            fVar167 = *(float *)(uVar48 + 0x48 + lVar35);
            uVar55 = *(uint *)(local_11a0 + 0x20 + local_1150);
            auVar20[0xc] = (char)(uVar55 >> 0x18);
            auVar20._0_12_ = ZEXT712(0);
            uVar59 = *(uint *)(local_11a8 + 0x20 + local_1150);
            auVar21[0xc] = (char)(uVar59 >> 0x18);
            auVar21._0_12_ = ZEXT712(0);
            fVar203 = *(float *)(uVar48 + 0x4c + lVar35);
            uVar50 = *(uint *)(local_11b0 + 0x20 + local_1150);
            auVar22[0xc] = (char)(uVar50 >> 0x18);
            auVar22._0_12_ = ZEXT712(0);
            uVar52 = *(uint *)(local_11b8 + 0x20 + local_1150);
            auVar23[0xc] = (char)(uVar52 >> 0x18);
            auVar23._0_12_ = ZEXT712(0);
            fVar176 = *(float *)(uVar48 + 0x40 + lVar35);
            auVar108._0_4_ = (((float)(uVar49 & 0xff) * fVar199 + fVar228) - fVar232) * fVar157;
            auVar108._4_4_ = (((float)(uVar49 >> 8 & 0xff) * fVar199 + fVar228) - fVar119) * fVar158
            ;
            auVar108._8_4_ =
                 (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar49 >> 0x10)) * fVar199 +
                  fVar228) - fVar136) * fVar159;
            auVar108._12_4_ =
                 (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar199 + fVar228) - fVar160) * fVar168;
            auVar163._0_4_ = (((float)(uVar55 & 0xff) * fVar167 + fVar65) - fVar137) * fVar204;
            auVar163._4_4_ = (((float)(uVar55 >> 8 & 0xff) * fVar167 + fVar65) - fVar138) * fVar207;
            auVar163._8_4_ =
                 (((float)(int)CONCAT32(auVar20._10_3_,(ushort)(byte)(uVar55 >> 0x10)) * fVar167 +
                  fVar65) - fVar139) * fVar208;
            auVar163._12_4_ =
                 (((float)(uint3)(auVar20._10_3_ >> 0x10) * fVar167 + fVar65) - fVar166) * fVar175;
            auVar140 = maxps(auVar108,auVar163);
            auVar124._0_4_ = (((float)(uVar51 & 0xff) * fVar199 + fVar228) - fVar232) * fVar192;
            auVar124._4_4_ = (((float)(uVar51 >> 8 & 0xff) * fVar199 + fVar228) - fVar119) * fVar193
            ;
            auVar124._8_4_ =
                 (((float)(int)CONCAT32(auVar19._10_3_,(ushort)(byte)(uVar51 >> 0x10)) * fVar199 +
                  fVar228) - fVar136) * fVar198;
            auVar124._12_4_ =
                 (((float)(uint3)(auVar19._10_3_ >> 0x10) * fVar199 + fVar228) - fVar160) * fVar197;
            auVar147._0_4_ = (((float)(uVar59 & 0xff) * fVar167 + fVar65) - fVar137) * local_1368;
            auVar147._4_4_ =
                 (((float)(uVar59 >> 8 & 0xff) * fVar167 + fVar65) - fVar138) * fStack_1364;
            auVar147._8_4_ =
                 (((float)(int)CONCAT32(auVar21._10_3_,(ushort)(byte)(uVar59 >> 0x10)) * fVar167 +
                  fVar65) - fVar139) * fStack_1360;
            auVar147._12_4_ =
                 (((float)(uint3)(auVar21._10_3_ >> 0x10) * fVar167 + fVar65) - fVar166) *
                 fStack_135c;
            auVar105 = minps(auVar124,auVar147);
            auVar171._0_4_ =
                 (((float)(uVar50 & 0xff) * fVar203 + fVar176) - local_1208) * local_1138;
            auVar171._4_4_ =
                 (((float)(uVar50 >> 8 & 0xff) * fVar203 + fVar176) - fStack_1204) * fStack_1134;
            auVar171._8_4_ =
                 (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar50 >> 0x10)) * fVar203 +
                  fVar176) - fStack_1200) * fStack_1130;
            auVar171._12_4_ =
                 (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar203 + fVar176) - fStack_11fc) *
                 fStack_112c;
            auVar172 = maxps(auVar171,local_1128);
            local_f88 = maxps(auVar140,auVar172);
            auVar178._0_4_ = (((float)(uVar52 & 0xff) * fVar203 + fVar176) - local_1208) * fVar186;
            auVar178._4_4_ =
                 (((float)(uVar52 >> 8 & 0xff) * fVar203 + fVar176) - fStack_1204) * fVar187;
            auVar178._8_4_ =
                 (((float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar52 >> 0x10)) * fVar203 +
                  fVar176) - fStack_1200) * fVar191;
            auVar178._12_4_ =
                 (((float)(uint3)(auVar23._10_3_ >> 0x10) * fVar203 + fVar176) - fStack_11fc) *
                 fVar205;
            auVar140 = minps(auVar178,auVar194);
            auVar140 = minps(auVar105,auVar140);
            auVar78[0xe] = bVar102;
            auVar78[0xf] = bVar102;
            auVar77._14_2_ = auVar78._14_2_;
            auVar77[0xd] = cVar100;
            auVar77._0_13_ = auVar68;
            auVar76._13_3_ = auVar77._13_3_;
            auVar76[0xc] = cVar100;
            auVar76._0_12_ = auVar67;
            auVar75._12_4_ = auVar76._12_4_;
            auVar75[0xb] = cVar99;
            auVar75._0_11_ = auVar66;
            auVar74._11_5_ = auVar75._11_5_;
            auVar74[10] = cVar99;
            auVar74._0_10_ = auVar66._0_10_;
            auVar73._10_6_ = auVar74._10_6_;
            auVar73[9] = cVar98;
            Var27 = CONCAT91(CONCAT81((long)(CONCAT72(auVar73._9_7_,CONCAT11(cVar98,bVar102)) >> 8),
                                      cVar97),cVar97);
            auVar26._2_10_ = Var27;
            auVar26[1] = cVar96;
            auVar26[0] = cVar96;
            auVar25._2_12_ = auVar26;
            auVar25[1] = cVar94;
            auVar25[0] = cVar94;
            auVar72._0_2_ = CONCAT11(cVar64,cVar64);
            auVar72._2_14_ = auVar25;
            uVar101 = (undefined2)Var27;
            auVar81._0_12_ = auVar72._0_12_;
            auVar81._12_2_ = uVar101;
            auVar81._14_2_ = uVar101;
            auVar80._12_4_ = auVar81._12_4_;
            auVar80._0_10_ = auVar72._0_10_;
            auVar80._10_2_ = auVar26._0_2_;
            auVar79._10_6_ = auVar80._10_6_;
            auVar79._0_8_ = auVar72._0_8_;
            auVar79._8_2_ = auVar26._0_2_;
            auVar28._4_8_ = auVar79._8_8_;
            auVar28._2_2_ = auVar25._0_2_;
            auVar28._0_2_ = auVar25._0_2_;
            uVar49 = CONCAT22(auVar72._0_2_,auVar72._0_2_);
            auVar109._0_4_ = -(uint)(local_f88._0_4_ <= auVar140._0_4_) & uVar49;
            auVar109._4_4_ = -(uint)(local_f88._4_4_ <= auVar140._4_4_) & auVar28._0_4_;
            auVar109._8_4_ = -(uint)(local_f88._8_4_ <= auVar140._8_4_) & auVar79._8_4_;
            auVar109._12_4_ = -(uint)(local_f88._12_4_ <= auVar140._12_4_) & auVar80._12_4_;
            uVar49 = movmskps((int)lVar35,auVar109);
            fVar203 = local_1368;
            fVar228 = fStack_1364;
            fVar65 = fStack_1360;
            fVar167 = fStack_135c;
            if (uVar49 != 0) {
              local_1148 = (ulong)(uVar49 & 0xff);
              do {
                lVar35 = 0;
                if (local_1148 != 0) {
                  for (; (local_1148 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                fVar199 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_f88 + lVar35 * 4) <= fVar199) {
                  local_11f8 = ZEXT416((uint)fVar199);
                  uVar49 = *(uint *)(local_1150 + 0x50);
                  uVar46 = CONCAT44(0,uVar49);
                  uVar51 = *(uint *)(local_1150 + 4 + lVar35 * 8);
                  pSVar36 = context->scene;
                  local_1458._0_8_ = uVar46;
                  pGVar10 = (pSVar36->geometries).items[uVar46].ptr;
                  uVar39 = *(ulong *)&pGVar10->field_0x58;
                  local_1460 = (ulong)uVar51;
                  lVar42 = (ulong)uVar51 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  lVar11 = *(long *)&pGVar10[1].time_range.upper;
                  uVar40 = *(ulong *)(local_1150 + lVar35 * 8);
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar40;
                  uVar41 = *(ulong *)(uVar39 + lVar42);
                  uVar44 = (ulong)((int)((ulong)(SUB164(auVar82 & _DAT_01fab9a0,0) >> 0x10) *
                                        (uVar41 >> 0x20)) +
                                  (int)uVar41 + (uint)SUB162(auVar82 & _DAT_01fab9a0,0));
                  p_Var12 = pGVar10[1].intersectionFilterN;
                  pfVar6 = (float *)(lVar11 + (long)p_Var12 * uVar44);
                  pfVar1 = (float *)(lVar11 + (uVar44 + 1) * (long)p_Var12);
                  local_1448 = *pfVar1;
                  local_1078 = pfVar1[1];
                  fVar228 = pfVar1[2];
                  uVar41 = uVar41 >> 0x20;
                  lVar35 = uVar44 + uVar41 + 1;
                  pfVar1 = (float *)(lVar11 + (uVar44 + uVar41) * (long)p_Var12);
                  local_1418._0_4_ = *pfVar1;
                  fVar65 = pfVar1[2];
                  pfVar2 = (float *)(lVar11 + lVar35 * (long)p_Var12);
                  local_13a8._0_4_ = *pfVar2;
                  local_13b8 = pfVar2[1];
                  local_13c8._0_4_ = pfVar2[2];
                  uVar45 = (ulong)(-1 < (short)uVar40);
                  pfVar2 = (float *)(lVar11 + (uVar44 + uVar45 + 1) * (long)p_Var12);
                  lVar43 = uVar45 + lVar35;
                  uVar45 = 0;
                  if (-1 < (short)(uVar40 >> 0x10)) {
                    uVar45 = uVar41;
                  }
                  pfVar3 = (float *)(lVar11 + lVar43 * (long)p_Var12);
                  local_13a8._4_4_ = *pfVar3;
                  fStack_13b4 = pfVar3[1];
                  local_13c8._4_4_ = pfVar3[2];
                  pfVar3 = (float *)(lVar11 + (uVar44 + uVar41 + uVar45) * (long)p_Var12);
                  pfVar4 = (float *)(lVar11 + (lVar35 + uVar45) * (long)p_Var12);
                  local_1394 = *pfVar4;
                  fStack_13ac = pfVar4[1];
                  pfVar5 = (float *)(lVar11 + (uVar45 + lVar43) * (long)p_Var12);
                  fStack_13b0 = pfVar5[1];
                  local_12e8 = CONCAT44(*pfVar2,local_1448);
                  local_13c8 = CONCAT44(local_13c8._4_4_,(float)local_13c8);
                  local_13a8 = CONCAT44(local_13a8._4_4_,(float)local_13a8);
                  local_1398 = *pfVar5;
                  fVar160 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar166 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar167 = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_fa8 = pfVar6[1] - fVar166;
                  fStack_fa4 = local_1078 - fVar166;
                  fStack_fa0 = local_13b8 - fVar166;
                  fStack_f9c = pfVar1[1] - fVar166;
                  fVar198 = pfVar6[2] - fVar167;
                  fVar204 = fVar228 - fVar167;
                  fStack_1350 = (float)local_13c8 - fVar167;
                  fStack_134c = fVar65 - fVar167;
                  fStack_1080 = fStack_13ac;
                  fStack_107c = pfVar3[1];
                  fVar139 = pfVar1[1] - fVar166;
                  fVar157 = local_13b8 - fVar166;
                  fVar158 = fStack_13ac - fVar166;
                  fVar159 = pfVar3[1] - fVar166;
                  local_1068 = CONCAT44((float)local_13c8,fVar65);
                  fVar65 = fVar65 - fVar167;
                  fVar168 = (float)local_13c8 - fVar167;
                  fVar197 = pfVar4[2] - fVar167;
                  fVar103 = pfVar3[2] - fVar167;
                  local_1438 = fVar139;
                  fStack_1434 = fVar157;
                  fStack_1430 = fVar158;
                  fStack_142c = fVar159;
                  local_fc8 = fVar139 - local_fa8;
                  fStack_fc4 = fVar157 - fStack_fa4;
                  fStack_fc0 = fVar158 - fStack_fa0;
                  fStack_fbc = fVar159 - fStack_f9c;
                  local_1428 = fVar65;
                  fStack_1424 = fVar168;
                  fStack_1420 = fVar197;
                  fStack_141c = fVar103;
                  local_fb8 = fVar65 - fVar198;
                  fStack_fb4 = fVar168 - fVar204;
                  fStack_fb0 = fVar197 - fStack_1350;
                  fStack_fac = fVar103 - fStack_134c;
                  local_f98 = *pfVar6 - fVar160;
                  fStack_f94 = local_1448 - fVar160;
                  fStack_f90 = (float)local_13a8 - fVar160;
                  fStack_f8c = (float)local_1418._0_4_ - fVar160;
                  local_1098 = CONCAT44((float)local_13a8,local_1418._0_4_);
                  local_1088 = local_1394;
                  fStack_1084 = *pfVar3;
                  local_1418._0_4_ = (float)local_1418._0_4_ - fVar160;
                  local_1418._4_4_ = (float)local_13a8 - fVar160;
                  fStack_1410 = local_1394 - fVar160;
                  fStack_140c = *pfVar3 - fVar160;
                  local_fd8 = (float)local_1418._0_4_ - local_f98;
                  fStack_fd4 = (float)local_1418._4_4_ - fStack_f94;
                  fStack_fd0 = fStack_1410 - fStack_f90;
                  fStack_fcc = fStack_140c - fStack_f8c;
                  local_1488._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
                  local_1478._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_12c8 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1478._0_4_ = local_1478._4_4_;
                  fStack_1470 = (float)local_1478._4_4_;
                  fStack_146c = (float)local_1478._4_4_;
                  local_1488._0_4_ = local_1488._4_4_;
                  fStack_1480 = (float)local_1488._4_4_;
                  fStack_147c = (float)local_1488._4_4_;
                  local_1018 = (local_fc8 * (fVar65 + fVar198) - local_fb8 * (fVar139 + local_fa8))
                               * (float)local_1488._4_4_ +
                               (local_fb8 * ((float)local_1418._0_4_ + local_f98) -
                               (fVar65 + fVar198) * local_fd8) * (float)local_1478._4_4_ +
                               ((fVar139 + local_fa8) * local_fd8 -
                               ((float)local_1418._0_4_ + local_f98) * local_fc8) * local_12c8;
                  fStack_1014 = (fStack_fc4 * (fVar168 + fVar204) -
                                fStack_fb4 * (fVar157 + fStack_fa4)) * (float)local_1488._4_4_ +
                                (fStack_fb4 * ((float)local_1418._4_4_ + fStack_f94) -
                                (fVar168 + fVar204) * fStack_fd4) * (float)local_1478._4_4_ +
                                ((fVar157 + fStack_fa4) * fStack_fd4 -
                                ((float)local_1418._4_4_ + fStack_f94) * fStack_fc4) * local_12c8;
                  fStack_1010 = (fStack_fc0 * (fVar197 + fStack_1350) -
                                fStack_fb0 * (fVar158 + fStack_fa0)) * (float)local_1488._4_4_ +
                                (fStack_fb0 * (fStack_1410 + fStack_f90) -
                                (fVar197 + fStack_1350) * fStack_fd0) * (float)local_1478._4_4_ +
                                ((fVar158 + fStack_fa0) * fStack_fd0 -
                                (fStack_1410 + fStack_f90) * fStack_fc0) * local_12c8;
                  fStack_100c = (fStack_fbc * (fVar103 + fStack_134c) -
                                fStack_fac * (fVar159 + fStack_f9c)) * (float)local_1488._4_4_ +
                                (fStack_fac * (fStack_140c + fStack_f8c) -
                                (fVar103 + fStack_134c) * fStack_fcc) * (float)local_1478._4_4_ +
                                ((fVar159 + fStack_f9c) * fStack_fcc -
                                (fStack_140c + fStack_f8c) * fStack_fbc) * local_12c8;
                  fStack_1074 = pfVar2[1];
                  fStack_1070 = fStack_13b4;
                  fStack_106c = local_13b8;
                  local_1348 = fVar166;
                  fStack_1344 = fVar166;
                  fStack_1340 = fVar166;
                  fStack_133c = fVar166;
                  fVar216 = local_1078 - fVar166;
                  fVar217 = pfVar2[1] - fVar166;
                  fVar218 = fStack_13b4 - fVar166;
                  fVar219 = local_13b8 - fVar166;
                  local_1058 = CONCAT44(pfVar2[2],fVar228);
                  local_1048._4_4_ = (float)local_13c8;
                  local_1048._0_4_ = local_13c8._4_4_;
                  local_1338 = fVar167;
                  fStack_1334 = fVar167;
                  fStack_1330 = fVar167;
                  fStack_132c = fVar167;
                  fVar228 = fVar228 - fVar167;
                  fVar205 = pfVar2[2] - fVar167;
                  fVar231 = local_13c8._4_4_ - fVar167;
                  fVar232 = (float)local_13c8 - fVar167;
                  fVar119 = local_fa8 - fVar216;
                  fVar136 = fStack_fa4 - fVar217;
                  fVar137 = fStack_fa0 - fVar218;
                  fVar138 = fStack_f9c - fVar219;
                  local_fe8 = fVar198 - fVar228;
                  fStack_fe4 = fVar204 - fVar205;
                  fStack_fe0 = fStack_1350 - fVar231;
                  fStack_fdc = fStack_134c - fVar232;
                  local_1358 = CONCAT44(fVar204,fVar198);
                  local_1328 = fVar160;
                  fStack_1324 = fVar160;
                  fStack_1320 = fVar160;
                  fStack_131c = fVar160;
                  local_1448 = local_1448 - fVar160;
                  fStack_1444 = *pfVar2 - fVar160;
                  auStack_1440[0] = (uint)(fStack_12e0 - fVar160);
                  auStack_143c[0] = (uint)(fStack_12dc - fVar160);
                  fVar220 = local_f98 - local_1448;
                  fVar222 = fStack_f94 - fStack_1444;
                  fVar224 = fStack_f90 - (float)auStack_1440[0];
                  fVar226 = fStack_f8c - (float)auStack_143c[0];
                  local_1008._0_4_ =
                       (fVar119 * (fVar198 + fVar228) - local_fe8 * (local_fa8 + fVar216)) *
                       (float)local_1488._4_4_ +
                       (local_fe8 * (local_f98 + local_1448) - (fVar198 + fVar228) * fVar220) *
                       (float)local_1478._4_4_ +
                       ((local_fa8 + fVar216) * fVar220 - (local_f98 + local_1448) * fVar119) *
                       local_12c8;
                  local_1008._4_4_ =
                       (fVar136 * (fVar204 + fVar205) - fStack_fe4 * (fStack_fa4 + fVar217)) *
                       (float)local_1488._4_4_ +
                       (fStack_fe4 * (fStack_f94 + fStack_1444) - (fVar204 + fVar205) * fVar222) *
                       (float)local_1478._4_4_ +
                       ((fStack_fa4 + fVar217) * fVar222 - (fStack_f94 + fStack_1444) * fVar136) *
                       local_12c8;
                  local_1008._8_4_ =
                       (fVar137 * (fStack_1350 + fVar231) - fStack_fe0 * (fStack_fa0 + fVar218)) *
                       (float)local_1488._4_4_ +
                       (fStack_fe0 * (fStack_f90 + (float)auStack_1440[0]) -
                       (fStack_1350 + fVar231) * fVar224) * (float)local_1478._4_4_ +
                       ((fStack_fa0 + fVar218) * fVar224 -
                       (fStack_f90 + (float)auStack_1440[0]) * fVar137) * local_12c8;
                  local_1008._12_4_ =
                       (fVar138 * (fStack_134c + fVar232) - fStack_fdc * (fStack_f9c + fVar219)) *
                       (float)local_1488._4_4_ +
                       (fStack_fdc * (fStack_f8c + (float)auStack_143c[0]) -
                       (fStack_134c + fVar232) * fVar226) * (float)local_1478._4_4_ +
                       ((fStack_f9c + fVar219) * fVar226 -
                       (fStack_f8c + (float)auStack_143c[0]) * fVar138) * local_12c8;
                  local_ff8 = fVar216 - fVar139;
                  fStack_ff4 = fVar217 - fVar157;
                  fStack_ff0 = fVar218 - fVar158;
                  fStack_fec = fVar219 - fVar159;
                  fVar203 = fVar228 - fVar65;
                  fVar176 = fVar205 - fVar168;
                  fVar175 = fVar231 - fVar197;
                  fVar104 = fVar232 - fVar103;
                  local_11d8 = fVar216;
                  fStack_11d4 = fVar217;
                  fStack_11d0 = fVar218;
                  fStack_11cc = fVar219;
                  local_12f8._0_4_ = fVar216 + fVar139;
                  local_12f8._4_4_ = fVar217 + fVar157;
                  fStack_12f0 = fVar218 + fVar158;
                  fStack_12ec = fVar219 + fVar159;
                  local_11e8 = fVar228;
                  fStack_11e4 = fVar205;
                  fStack_11e0 = fVar231;
                  fStack_11dc = fVar232;
                  local_1318._0_4_ = fVar228 + fVar65;
                  local_1318._4_4_ = fVar205 + fVar168;
                  fStack_1310 = fVar231 + fVar197;
                  fStack_130c = fVar232 + fVar103;
                  fVar207 = local_1448 - (float)local_1418._0_4_;
                  fVar208 = fStack_1444 - (float)local_1418._4_4_;
                  fVar209 = (float)auStack_1440[0] - fStack_1410;
                  fVar210 = (float)auStack_143c[0] - fStack_140c;
                  local_1308._0_4_ = local_1448 + (float)local_1418._0_4_;
                  local_1308._4_4_ = fStack_1444 + (float)local_1418._4_4_;
                  fStack_1300 = (float)auStack_1440[0] + fStack_1410;
                  fStack_12fc = (float)auStack_143c[0] + fStack_140c;
                  fStack_12c4 = local_12c8;
                  fStack_12c0 = local_12c8;
                  fStack_12bc = local_12c8;
                  auVar164._0_4_ =
                       (local_ff8 * (float)local_1318._0_4_ - fVar203 * (float)local_12f8._0_4_) *
                       (float)local_1488._4_4_ +
                       (fVar203 * (float)local_1308._0_4_ - fVar207 * (float)local_1318._0_4_) *
                       (float)local_1478._4_4_ +
                       (fVar207 * (float)local_12f8._0_4_ - local_ff8 * (float)local_1308._0_4_) *
                       local_12c8;
                  auVar164._4_4_ =
                       (fStack_ff4 * (float)local_1318._4_4_ - fVar176 * (float)local_12f8._4_4_) *
                       (float)local_1488._4_4_ +
                       (fVar176 * (float)local_1308._4_4_ - fVar208 * (float)local_1318._4_4_) *
                       (float)local_1478._4_4_ +
                       (fVar208 * (float)local_12f8._4_4_ - fStack_ff4 * (float)local_1308._4_4_) *
                       local_12c8;
                  auVar164._8_4_ =
                       (fStack_ff0 * fStack_1310 - fVar175 * fStack_12f0) * (float)local_1488._4_4_
                       + (fVar175 * fStack_1300 - fVar209 * fStack_1310) * (float)local_1478._4_4_ +
                         (fVar209 * fStack_12f0 - fStack_ff0 * fStack_1300) * local_12c8;
                  auVar164._12_4_ =
                       (fStack_fec * fStack_130c - fVar104 * fStack_12ec) * (float)local_1488._4_4_
                       + (fVar104 * fStack_12fc - fVar210 * fStack_130c) * (float)local_1478._4_4_ +
                         (fVar210 * fStack_12ec - fStack_fec * fStack_12fc) * local_12c8;
                  fVar177 = local_1018 + local_1008._0_4_ + auVar164._0_4_;
                  fVar184 = fStack_1014 + local_1008._4_4_ + auVar164._4_4_;
                  fVar185 = fStack_1010 + local_1008._8_4_ + auVar164._8_4_;
                  fVar186 = fStack_100c + local_1008._12_4_ + auVar164._12_4_;
                  auVar173._4_4_ = fStack_1014;
                  auVar173._0_4_ = local_1018;
                  auVar173._8_4_ = fStack_1010;
                  auVar173._12_4_ = fStack_100c;
                  auVar140 = minps(auVar173,local_1008);
                  auVar105 = minps(auVar140,auVar164);
                  auVar148._4_4_ = fStack_1014;
                  auVar148._0_4_ = local_1018;
                  auVar148._8_4_ = fStack_1010;
                  auVar148._12_4_ = fStack_100c;
                  auVar140 = maxps(auVar148,local_1008);
                  auVar140 = maxps(auVar140,auVar164);
                  fVar187 = ABS(fVar177);
                  fVar191 = ABS(fVar184);
                  fVar192 = ABS(fVar185);
                  fVar193 = ABS(fVar186);
                  auVar149._0_4_ =
                       -(uint)(auVar140._0_4_ <= fVar187 * 1.1920929e-07 ||
                              -(fVar187 * 1.1920929e-07) <= auVar105._0_4_) & local_1118;
                  auVar149._4_4_ =
                       -(uint)(auVar140._4_4_ <= fVar191 * 1.1920929e-07 ||
                              -(fVar191 * 1.1920929e-07) <= auVar105._4_4_) & uStack_1114;
                  auVar149._8_4_ =
                       -(uint)(auVar140._8_4_ <= fVar192 * 1.1920929e-07 ||
                              -(fVar192 * 1.1920929e-07) <= auVar105._8_4_) & uStack_1110;
                  auVar149._12_4_ =
                       -(uint)(auVar140._12_4_ <= fVar193 * 1.1920929e-07 ||
                              -(fVar193 * 1.1920929e-07) <= auVar105._12_4_) & uStack_110c;
                  iVar38 = movmskps((int)lVar11,auVar149);
                  local_1108 = local_13a8._4_4_;
                  fStack_1104 = local_13a8._4_4_;
                  fStack_1100 = local_13a8._4_4_;
                  fStack_10fc = local_13a8._4_4_;
                  fStack_12d4 = (float)local_13a8;
                  local_12d8 = (float)local_13a8;
                  fStack_12d0 = (float)local_13a8;
                  fStack_12cc = (float)local_13a8;
                  auVar150._4_12_ = auVar149._4_12_;
                  if (iVar38 != 0) {
                    local_1038 = fVar187;
                    fStack_1034 = fVar191;
                    fStack_1030 = fVar192;
                    fStack_102c = fVar193;
                    local_1028 = fVar177;
                    fStack_1024 = fVar184;
                    fStack_1020 = fVar185;
                    fStack_101c = fVar186;
                    uVar55 = -(uint)(ABS(local_fe8 * local_ff8) <= ABS(local_fb8 * fVar119));
                    uVar52 = -(uint)(ABS(fStack_fe4 * fStack_ff4) <= ABS(fStack_fb4 * fVar136));
                    uVar56 = -(uint)(ABS(fStack_fe0 * fStack_ff0) <= ABS(fStack_fb0 * fVar137));
                    uVar60 = -(uint)(ABS(fStack_fdc * fStack_fec) <= ABS(fStack_fac * fVar138));
                    auVar188._0_4_ = local_fb8 * fVar220 - local_fd8 * local_fe8;
                    auVar188._4_4_ = fStack_fb4 * fVar222 - fStack_fd4 * fStack_fe4;
                    auVar188._8_4_ = fStack_fb0 * fVar224 - fStack_fd0 * fStack_fe0;
                    auVar188._12_4_ = fStack_fac * fVar226 - fStack_fcc * fStack_fdc;
                    uVar59 = -(uint)(ABS(fVar220 * fVar203) <= ABS(local_fd8 * local_fe8));
                    uVar53 = -(uint)(ABS(fVar222 * fVar176) <= ABS(fStack_fd4 * fStack_fe4));
                    uVar57 = -(uint)(ABS(fVar224 * fVar175) <= ABS(fStack_fd0 * fStack_fe0));
                    uVar61 = -(uint)(ABS(fVar226 * fVar104) <= ABS(fStack_fcc * fStack_fdc));
                    uVar50 = -(uint)(ABS(fVar119 * fVar207) <= ABS(local_fc8 * fVar220));
                    uVar54 = -(uint)(ABS(fVar136 * fVar208) <= ABS(fStack_fc4 * fVar222));
                    uVar58 = -(uint)(ABS(fVar137 * fVar209) <= ABS(fStack_fc0 * fVar224));
                    uVar62 = -(uint)(ABS(fVar138 * fVar210) <= ABS(fStack_fbc * fVar226));
                    local_1238[0] =
                         (float)(~uVar55 & (uint)(local_fc8 * local_fe8 - local_fb8 * fVar119) |
                                (uint)(fVar119 * fVar203 - local_fe8 * local_ff8) & uVar55);
                    local_1238[1] =
                         (float)(~uVar52 & (uint)(fStack_fc4 * fStack_fe4 - fStack_fb4 * fVar136) |
                                (uint)(fVar136 * fVar176 - fStack_fe4 * fStack_ff4) & uVar52);
                    local_1238[2] =
                         (float)(~uVar56 & (uint)(fStack_fc0 * fStack_fe0 - fStack_fb0 * fVar137) |
                                (uint)(fVar137 * fVar175 - fStack_fe0 * fStack_ff0) & uVar56);
                    local_1238[3] =
                         (float)(~uVar60 & (uint)(fStack_fbc * fStack_fdc - fStack_fac * fVar138) |
                                (uint)(fVar138 * fVar104 - fStack_fdc * fStack_fec) & uVar60);
                    local_1228._0_4_ =
                         ~uVar59 & (uint)auVar188._0_4_ |
                         (uint)(local_fe8 * fVar207 - fVar220 * fVar203) & uVar59;
                    local_1228._4_4_ =
                         ~uVar53 & (uint)auVar188._4_4_ |
                         (uint)(fStack_fe4 * fVar208 - fVar222 * fVar176) & uVar53;
                    fStack_1220 = (float)(~uVar57 & (uint)auVar188._8_4_ |
                                         (uint)(fStack_fe0 * fVar209 - fVar224 * fVar175) & uVar57);
                    fStack_121c = (float)(~uVar61 & (uint)auVar188._12_4_ |
                                         (uint)(fStack_fdc * fVar210 - fVar226 * fVar104) & uVar61);
                    local_1218[0] =
                         (float)(~uVar50 & (uint)(local_fd8 * fVar119 - local_fc8 * fVar220) |
                                (uint)(fVar220 * local_ff8 - fVar119 * fVar207) & uVar50);
                    local_1218[1] =
                         (float)(~uVar54 & (uint)(fStack_fd4 * fVar136 - fStack_fc4 * fVar222) |
                                (uint)(fVar222 * fStack_ff4 - fVar136 * fVar208) & uVar54);
                    local_1218[2] =
                         (float)(~uVar58 & (uint)(fStack_fd0 * fVar137 - fStack_fc0 * fVar224) |
                                (uint)(fVar224 * fStack_ff0 - fVar137 * fVar209) & uVar58);
                    local_1218[3] =
                         (float)(~uVar62 & (uint)(fStack_fcc * fVar138 - fStack_fbc * fVar226) |
                                (uint)(fVar226 * fStack_fec - fVar138 * fVar210) & uVar62);
                    fVar203 = (float)local_1488._4_4_ * local_1238[0] +
                              (float)local_1478._4_4_ * (float)local_1228._0_4_ +
                              local_12c8 * local_1218[0];
                    fVar176 = (float)local_1488._4_4_ * local_1238[1] +
                              (float)local_1478._4_4_ * (float)local_1228._4_4_ +
                              local_12c8 * local_1218[1];
                    fVar175 = (float)local_1488._4_4_ * local_1238[2] +
                              (float)local_1478._4_4_ * fStack_1220 + local_12c8 * local_1218[2];
                    fVar104 = (float)local_1488._4_4_ * local_1238[3] +
                              (float)local_1478._4_4_ * fStack_121c + local_12c8 * local_1218[3];
                    auVar125._0_4_ = fVar203 + fVar203;
                    auVar125._4_4_ = fVar176 + fVar176;
                    auVar125._8_4_ = fVar175 + fVar175;
                    auVar125._12_4_ = fVar104 + fVar104;
                    fVar203 = local_f98 * local_1238[0] +
                              local_fa8 * (float)local_1228._0_4_ + fVar198 * local_1218[0];
                    fVar175 = fStack_f94 * local_1238[1] +
                              fStack_fa4 * (float)local_1228._4_4_ + fVar204 * local_1218[1];
                    fVar104 = fStack_f90 * local_1238[2] +
                              fStack_fa0 * fStack_1220 + fStack_1350 * local_1218[2];
                    fVar119 = fStack_f8c * local_1238[3] +
                              fStack_f9c * fStack_121c + fStack_134c * local_1218[3];
                    auVar140 = rcpps(auVar188,auVar125);
                    fVar176 = auVar140._0_4_;
                    fVar136 = auVar140._4_4_;
                    fVar137 = auVar140._8_4_;
                    fVar138 = auVar140._12_4_;
                    fVar176 = ((1.0 - auVar125._0_4_ * fVar176) * fVar176 + fVar176) *
                              (fVar203 + fVar203);
                    fVar175 = ((1.0 - auVar125._4_4_ * fVar136) * fVar136 + fVar136) *
                              (fVar175 + fVar175);
                    fVar104 = ((1.0 - auVar125._8_4_ * fVar137) * fVar137 + fVar137) *
                              (fVar104 + fVar104);
                    fVar119 = ((1.0 - auVar125._12_4_ * fVar138) * fVar138 + fVar138) *
                              (fVar119 + fVar119);
                    fVar203 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar126._0_4_ =
                         (int)((uint)((fVar176 <= fVar199 && fVar203 <= fVar176) &&
                                     auVar125._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar126._4_4_ =
                         (int)((uint)((fVar175 <= fVar199 && fVar203 <= fVar175) &&
                                     auVar125._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar126._8_4_ =
                         (int)((uint)((fVar104 <= fVar199 && fVar203 <= fVar104) &&
                                     auVar125._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar126._12_4_ =
                         (int)((uint)((fVar119 <= fVar199 && fVar203 <= fVar119) &&
                                     auVar125._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar127 = auVar126 & auVar149;
                    iVar38 = movmskps(iVar38,auVar127);
                    if (iVar38 != 0) {
                      local_1298._4_4_ = fVar184;
                      local_1298._0_4_ = fVar177;
                      local_1298._8_4_ = fVar185;
                      local_1298._12_4_ = fVar186;
                      local_1288 = &local_148d;
                      local_1278 = auVar127;
                      local_1248._4_4_ = fVar175;
                      local_1248._0_4_ = fVar176;
                      fStack_1240 = fVar104;
                      fStack_123c = fVar119;
                      auVar150._0_4_ = (float)(int)(*(ushort *)(uVar39 + 8 + lVar42) - 1);
                      auVar195._4_4_ = auVar149._4_4_;
                      auVar195._0_4_ = auVar150._0_4_;
                      auVar195._8_4_ = auVar149._8_4_;
                      auVar195._12_4_ = auVar149._12_4_;
                      auVar140 = rcpss(auVar195,auVar150);
                      fVar199 = (float)(int)(*(ushort *)(uVar39 + 10 + lVar42) - 1);
                      fStack_12ac = (2.0 - auVar150._0_4_ * auVar140._0_4_) * auVar140._0_4_;
                      auVar140 = rcpss(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                      fVar199 = (2.0 - fVar199 * auVar140._0_4_) * auVar140._0_4_;
                      local_12b8._0_4_ =
                           fStack_12ac * (local_1018 + (float)(int)local_13a8._4_4_ * fVar177);
                      local_12b8._4_4_ =
                           fStack_12ac *
                           (fStack_1014 + (float)((int)local_13a8._4_4_ + 1) * fVar184);
                      fStack_12b0 = fStack_12ac *
                                    (fStack_1010 + (float)((int)local_13a8._4_4_ + 1) * fVar185);
                      fStack_12ac = fStack_12ac *
                                    (fStack_100c + (float)(int)local_13a8._4_4_ * fVar186);
                      auVar110._0_4_ = (float)(int)(float)local_13a8 * fVar177 + local_1008._0_4_;
                      auVar110._4_4_ = (float)(int)(float)local_13a8 * fVar184 + local_1008._4_4_;
                      auVar110._8_4_ =
                           (float)((int)(float)local_13a8 + 1) * fVar185 + local_1008._8_4_;
                      auVar110._12_4_ =
                           (float)((int)(float)local_13a8 + 1) * fVar186 + local_1008._12_4_;
                      local_12a8._4_4_ = fVar199 * auVar110._4_4_;
                      local_12a8._0_4_ = fVar199 * auVar110._0_4_;
                      fStack_12a0 = fVar199 * auVar110._8_4_;
                      fStack_129c = fVar199 * auVar110._12_4_;
                      pGVar10 = (pSVar36->geometries).items[uVar46].ptr;
                      uVar55 = (ray->super_RayK<1>).mask;
                      pSVar36 = (Scene *)(ulong)uVar55;
                      if ((pGVar10->mask & uVar55) != 0) {
                        local_1358 = lVar42;
                        local_11f8._8_8_ = 0;
                        local_11f8._0_8_ = uVar39;
                        local_1408 = auVar127;
                        auVar140 = rcpps(auVar110,local_1298);
                        fVar203 = auVar140._0_4_;
                        fVar136 = auVar140._4_4_;
                        fVar137 = auVar140._8_4_;
                        fVar138 = auVar140._12_4_;
                        fVar203 = (float)(-(uint)(1e-18 <= fVar187) &
                                         (uint)(((float)DAT_01f7ba10 - fVar177 * fVar203) * fVar203
                                               + fVar203));
                        fVar136 = (float)(-(uint)(1e-18 <= fVar191) &
                                         (uint)((DAT_01f7ba10._4_4_ - fVar184 * fVar136) * fVar136 +
                                               fVar136));
                        fVar137 = (float)(-(uint)(1e-18 <= fVar192) &
                                         (uint)((DAT_01f7ba10._8_4_ - fVar185 * fVar137) * fVar137 +
                                               fVar137));
                        fVar138 = (float)(-(uint)(1e-18 <= fVar193) &
                                         (uint)((DAT_01f7ba10._12_4_ - fVar186 * fVar138) * fVar138
                                               + fVar138));
                        auVar83._0_4_ = (float)local_12b8._0_4_ * fVar203;
                        auVar83._4_4_ = (float)local_12b8._4_4_ * fVar136;
                        auVar83._8_4_ = fStack_12b0 * fVar137;
                        auVar83._12_4_ = fStack_12ac * fVar138;
                        local_1268 = minps(auVar83,_DAT_01f7ba10);
                        auVar151._0_4_ = fVar199 * auVar110._0_4_ * fVar203;
                        auVar151._4_4_ = fVar199 * auVar110._4_4_ * fVar136;
                        auVar151._8_4_ = fVar199 * auVar110._8_4_ * fVar137;
                        auVar151._12_4_ = fVar199 * auVar110._12_4_ * fVar138;
                        local_1258 = minps(auVar151,_DAT_01f7ba10);
                        uVar59 = auVar127._0_4_;
                        auVar174._0_4_ = (uint)fVar176 & uVar59;
                        uVar50 = auVar127._4_4_;
                        auVar174._4_4_ = (uint)fVar175 & uVar50;
                        uVar52 = auVar127._8_4_;
                        auVar174._8_4_ = (uint)fVar104 & uVar52;
                        uVar53 = auVar127._12_4_;
                        auVar174._12_4_ = (uint)fVar119 & uVar53;
                        auVar111._0_8_ = CONCAT44(~uVar50,~uVar59) & 0x7f8000007f800000;
                        auVar111._8_4_ = ~uVar52 & 0x7f800000;
                        auVar111._12_4_ = ~uVar53 & 0x7f800000;
                        auVar111 = auVar111 | auVar174;
                        auVar152._4_4_ = auVar111._0_4_;
                        auVar152._0_4_ = auVar111._4_4_;
                        auVar152._8_4_ = auVar111._12_4_;
                        auVar152._12_4_ = auVar111._8_4_;
                        auVar140 = minps(auVar152,auVar111);
                        auVar84._0_8_ = auVar140._8_8_;
                        auVar84._8_4_ = auVar140._0_4_;
                        auVar84._12_4_ = auVar140._4_4_;
                        auVar140 = minps(auVar84,auVar140);
                        auVar85._0_8_ =
                             CONCAT44(-(uint)(auVar140._4_4_ == auVar111._4_4_) & uVar50,
                                      -(uint)(auVar140._0_4_ == auVar111._0_4_) & uVar59);
                        auVar85._8_4_ = -(uint)(auVar140._8_4_ == auVar111._8_4_) & uVar52;
                        auVar85._12_4_ = -(uint)(auVar140._12_4_ == auVar111._12_4_) & uVar53;
                        iVar38 = movmskps(uVar55,auVar85);
                        if (iVar38 != 0) {
                          auVar127._8_4_ = auVar85._8_4_;
                          auVar127._0_8_ = auVar85._0_8_;
                          auVar127._12_4_ = auVar85._12_4_;
                        }
                        uVar55 = movmskps(iVar38,auVar127);
                        lVar35 = 0;
                        if (uVar55 != 0) {
                          for (; (uVar55 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                          }
                        }
                        pRVar13 = context->args;
                        if ((pRVar13->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar199 = *(float *)(local_1268 + lVar35 * 4);
                          fVar203 = *(float *)(local_1258 + lVar35 * 4);
                          fVar176 = local_1238[lVar35];
                          fVar175 = local_1218[lVar35 + -4];
                          fVar104 = local_1218[lVar35];
                          (ray->super_RayK<1>).tfar = local_1238[lVar35 + -4];
                          (ray->Ng).field_0.field_0.x = fVar176;
                          (ray->Ng).field_0.field_0.y = fVar175;
                          (ray->Ng).field_0.field_0.z = fVar104;
                          ray->u = fVar199;
                          ray->v = fVar203;
                          ray->primID = uVar51;
                          ray->geomID = uVar49;
                          pRVar47 = context->user;
                          ray->instID[0] = pRVar47->instID[0];
                          uVar49 = pRVar47->instPrimID[0];
                          pSVar36 = (Scene *)(ulong)uVar49;
                          ray->instPrimID[0] = uVar49;
                        }
                        else {
                          pRVar47 = context->user;
                          _local_1488 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                          fStack_1470 = fVar104;
                          local_1478 = local_1248;
                          fStack_146c = fVar119;
LAB_00d2aae4:
                          local_138c = *(undefined4 *)(local_1268 + lVar35 * 4);
                          local_1388 = *(undefined4 *)(local_1258 + lVar35 * 4);
                          (ray->super_RayK<1>).tfar = local_1238[lVar35 + -4];
                          local_1398 = local_1238[lVar35];
                          local_1394 = local_1218[lVar35 + -4];
                          local_1390 = local_1218[lVar35];
                          local_1384 = (int)local_1460;
                          local_1380 = local_1458._0_4_;
                          local_137c = pRVar47->instID[0];
                          local_1378 = pRVar47->instPrimID[0];
                          local_148c = (undefined1  [4])0xffffffff;
                          local_13f8.valid = (int *)local_148c;
                          local_13f8.geometryUserPtr = pGVar10->userPtr;
                          local_13f8.context = pRVar47;
                          local_13f8.ray = (RTCRayN *)ray;
                          local_13f8.hit = (RTCHitN *)&local_1398;
                          local_13f8.N = 1;
                          if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00d2abed:
                            if ((pRVar13->filter != (RTCFilterFunctionN)0x0) &&
                               (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                              (*pRVar13->filter)(&local_13f8);
                              fVar176 = (float)local_1478._0_4_;
                              fVar175 = (float)local_1478._4_4_;
                              fVar104 = fStack_1470;
                              fVar119 = fStack_146c;
                              if ((((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] == 0.0)
                              goto LAB_00d2ac7c;
                            }
                            (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.x =
                                 *(float *)local_13f8.hit;
                            (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_13f8.hit + 4);
                            (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_13f8.hit + 8);
                            *(float *)((long)local_13f8.ray + 0x3c) =
                                 *(float *)(local_13f8.hit + 0xc);
                            *(float *)((long)local_13f8.ray + 0x40) =
                                 *(float *)(local_13f8.hit + 0x10);
                            *(float *)((long)local_13f8.ray + 0x44) =
                                 *(float *)(local_13f8.hit + 0x14);
                            *(float *)((long)local_13f8.ray + 0x48) =
                                 *(float *)(local_13f8.hit + 0x18);
                            *(float *)((long)local_13f8.ray + 0x4c) =
                                 *(float *)(local_13f8.hit + 0x1c);
                            *(float *)((long)local_13f8.ray + 0x50) =
                                 *(float *)(local_13f8.hit + 0x20);
                            pRVar37 = (RayHit *)local_13f8.ray;
                          }
                          else {
                            (*pGVar10->intersectionFilterN)(&local_13f8);
                            fVar176 = (float)local_1478._0_4_;
                            fVar175 = (float)local_1478._4_4_;
                            fVar104 = fStack_1470;
                            fVar119 = fStack_146c;
                            if ((((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] != 0.0)
                            goto LAB_00d2abed;
LAB_00d2ac7c:
                            (ray->super_RayK<1>).tfar = (float)local_1488._0_4_;
                            pRVar37 = (RayHit *)local_13f8.valid;
                          }
                          *(undefined4 *)(local_1408 + lVar35 * 4) = 0;
                          fVar228 = (ray->super_RayK<1>).tfar;
                          auVar91._0_4_ = -(uint)(fVar176 <= fVar228) & local_1408._0_4_;
                          auVar91._4_4_ = -(uint)(fVar175 <= fVar228) & local_1408._4_4_;
                          auVar91._8_4_ = -(uint)(fVar104 <= fVar228) & local_1408._8_4_;
                          auVar91._12_4_ = -(uint)(fVar119 <= fVar228) & local_1408._12_4_;
                          local_1408 = auVar91;
                          uVar34 = (undefined4)((ulong)pRVar37 >> 0x20);
                          iVar38 = movmskps((int)pRVar37,auVar91);
                          pSVar36 = (Scene *)CONCAT44(uVar34,iVar38);
                          if (iVar38 != 0) {
                            local_1488._0_4_ = (ray->super_RayK<1>).tfar;
                            local_1488._4_4_ = (ray->super_RayK<1>).mask;
                            fStack_1480 = (float)(ray->super_RayK<1>).id;
                            fStack_147c = (float)(ray->super_RayK<1>).flags;
                            auVar113._0_4_ = auVar91._0_4_ & (uint)fVar176;
                            auVar113._4_4_ = auVar91._4_4_ & (uint)fVar175;
                            auVar113._8_4_ = auVar91._8_4_ & (uint)fVar104;
                            auVar113._12_4_ = auVar91._12_4_ & (uint)fVar119;
                            auVar134._0_8_ =
                                 CONCAT44(~auVar91._4_4_,~auVar91._0_4_) & 0x7f8000007f800000;
                            auVar134._8_4_ = ~auVar91._8_4_ & 0x7f800000;
                            auVar134._12_4_ = ~auVar91._12_4_ & 0x7f800000;
                            auVar134 = auVar134 | auVar113;
                            auVar155._4_4_ = auVar134._0_4_;
                            auVar155._0_4_ = auVar134._4_4_;
                            auVar155._8_4_ = auVar134._12_4_;
                            auVar155._12_4_ = auVar134._8_4_;
                            auVar140 = minps(auVar155,auVar134);
                            auVar114._0_8_ = auVar140._8_8_;
                            auVar114._8_4_ = auVar140._0_4_;
                            auVar114._12_4_ = auVar140._4_4_;
                            auVar140 = minps(auVar114,auVar140);
                            auVar115._0_8_ =
                                 CONCAT44(-(uint)(auVar140._4_4_ == auVar134._4_4_) & auVar91._4_4_,
                                          -(uint)(auVar140._0_4_ == auVar134._0_4_) & auVar91._0_4_)
                            ;
                            auVar115._8_4_ =
                                 -(uint)(auVar140._8_4_ == auVar134._8_4_) & auVar91._8_4_;
                            auVar115._12_4_ =
                                 -(uint)(auVar140._12_4_ == auVar134._12_4_) & auVar91._12_4_;
                            iVar38 = movmskps(iVar38,auVar115);
                            if (iVar38 != 0) {
                              auVar91._8_4_ = auVar115._8_4_;
                              auVar91._0_8_ = auVar115._0_8_;
                              auVar91._12_4_ = auVar115._12_4_;
                            }
                            uVar33 = movmskps(iVar38,auVar91);
                            uVar40 = CONCAT44(uVar34,uVar33);
                            lVar35 = 0;
                            if (uVar40 != 0) {
                              for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                              }
                            }
                            goto LAB_00d2aae4;
                          }
                          fVar160 = (ray->super_RayK<1>).org.field_0.m128[0];
                          fVar166 = (ray->super_RayK<1>).org.field_0.m128[1];
                          fVar167 = (ray->super_RayK<1>).org.field_0.m128[2];
                          local_1488._4_4_ = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
                          local_1478._4_4_ =
                               *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
                          local_12c8 = (ray->super_RayK<1>).dir.field_0.m128[2];
                          local_1478._0_4_ = local_1478._4_4_;
                          fStack_1470 = (float)local_1478._4_4_;
                          fStack_146c = (float)local_1478._4_4_;
                          fStack_12c4 = local_12c8;
                          fStack_12c0 = local_12c8;
                          fStack_12bc = local_12c8;
                          fVar139 = local_1088 - fVar166;
                          fVar157 = fStack_1084 - fVar166;
                          fVar158 = fStack_1080 - fVar166;
                          fVar159 = fStack_107c - fVar166;
                          fVar65 = (float)local_1068 - fVar167;
                          fVar168 = local_1068._4_4_ - fVar167;
                          fVar197 = fStack_1060 - fVar167;
                          fVar103 = fStack_105c - fVar167;
                          local_1448 = (float)local_12e8 - fVar160;
                          fStack_1444 = local_12e8._4_4_ - fVar160;
                          auStack_1440[0] = (uint)(fStack_12e0 - fVar160);
                          auStack_143c[0] = (uint)(fStack_12dc - fVar160);
                          fVar216 = local_1078 - fVar166;
                          fVar217 = fStack_1074 - fVar166;
                          fVar218 = fStack_1070 - fVar166;
                          fVar219 = fStack_106c - fVar166;
                          fVar228 = (float)local_1058 - fVar167;
                          fVar205 = local_1058._4_4_ - fVar167;
                          fVar231 = fStack_1050 - fVar167;
                          fVar232 = fStack_104c - fVar167;
                          local_1308._4_4_ = (local_1098._4_4_ - fVar160) + fStack_1444;
                          local_1308._0_4_ = ((float)local_1098 - fVar160) + local_1448;
                          fStack_1300 = (fStack_1090 - fVar160) + (float)auStack_1440[0];
                          fStack_12fc = (fStack_108c - fVar160) + (float)auStack_143c[0];
                          local_12f8._4_4_ = fVar157 + fVar217;
                          local_12f8._0_4_ = fVar139 + fVar216;
                          fStack_12f0 = fVar158 + fVar218;
                          fStack_12ec = fVar159 + fVar219;
                          local_1318._4_4_ = fVar168 + fVar205;
                          local_1318._0_4_ = fVar65 + fVar228;
                          fStack_1310 = fVar197 + fVar231;
                          fStack_130c = fVar103 + fVar232;
                          local_1418._4_4_ = local_1098._4_4_ - fVar160;
                          local_1418._0_4_ = (float)local_1098 - fVar160;
                          fStack_1410 = fStack_1090 - fVar160;
                          fStack_140c = fStack_108c - fVar160;
                          context = local_1468;
                        }
                        local_1488._0_4_ = local_1488._4_4_;
                        fStack_1480 = (float)local_1488._4_4_;
                        fStack_147c = (float)local_1488._4_4_;
                        lVar42 = local_1358;
                        uVar39 = local_11f8._0_8_;
                      }
                    }
                  }
                  local_13c8._0_4_ = (float)local_13c8 - fVar167;
                  local_13c8._4_4_ = local_13c8._4_4_ - fVar167;
                  fStack_13c0 = fStack_13c0 - fVar167;
                  fStack_13bc = fStack_13bc - fVar167;
                  local_13b8 = local_13b8 - fVar166;
                  fStack_13b4 = fStack_13b4 - fVar166;
                  fStack_13b0 = fStack_13b0 - fVar166;
                  fStack_13ac = fStack_13ac - fVar166;
                  local_13a8._0_4_ = (float)local_13a8 - fVar160;
                  local_13a8._4_4_ = local_13a8._4_4_ - fVar160;
                  fStack_13a0 = fStack_13a0 - fVar160;
                  fStack_139c = fStack_139c - fVar160;
                  local_1438 = local_1448 - (float)local_13a8;
                  fStack_1434 = fStack_1444 - local_13a8._4_4_;
                  fStack_1430 = (float)auStack_1440[0] - fStack_13a0;
                  fStack_142c = (float)auStack_143c[0] - fStack_139c;
                  fVar211 = fVar216 - local_13b8;
                  fVar212 = fVar217 - fStack_13b4;
                  fVar213 = fVar218 - fStack_13b0;
                  fVar214 = fVar219 - fStack_13ac;
                  fVar229 = fVar228 - (float)local_13c8;
                  fVar230 = fVar205 - local_13c8._4_4_;
                  fStack_12e0 = fVar231 - fStack_13c0;
                  fStack_12dc = fVar232 - fStack_13bc;
                  local_1428 = fVar139 - fVar216;
                  fStack_1424 = fVar157 - fVar217;
                  fStack_1420 = fVar158 - fVar218;
                  fStack_141c = fVar159 - fVar219;
                  fVar220 = fVar65 - fVar228;
                  fVar222 = fVar168 - fVar205;
                  fVar224 = fVar197 - fVar231;
                  fVar226 = fVar103 - fVar232;
                  fVar199 = (float)local_1418._0_4_ - local_1448;
                  fVar176 = (float)local_1418._4_4_ - fStack_1444;
                  fVar104 = fStack_1410 - (float)auStack_1440[0];
                  fVar177 = fStack_140c - (float)auStack_143c[0];
                  fVar160 = local_1448 + (float)local_13a8;
                  fVar166 = fStack_1444 + local_13a8._4_4_;
                  fVar167 = (float)auStack_1440[0] + fStack_13a0;
                  fVar203 = (float)auStack_143c[0] + fStack_139c;
                  local_12e8 = CONCAT44(fVar230,fVar229);
                  local_1448 = fVar211;
                  fStack_1444 = fVar212;
                  auStack_1440[0] = (uint)fVar213;
                  auStack_143c[0] = (uint)fVar214;
                  fVar184 = local_13b8 - fVar139;
                  fVar185 = fStack_13b4 - fVar157;
                  fVar209 = fStack_13b0 - fVar158;
                  fVar210 = fStack_13ac - fVar159;
                  fVar221 = (float)local_13c8 - fVar65;
                  fVar223 = local_13c8._4_4_ - fVar168;
                  fVar225 = fStack_13c0 - fVar197;
                  fVar227 = fStack_13bc - fVar103;
                  fVar216 = (fVar211 * (fVar228 + (float)local_13c8) -
                            fVar229 * (fVar216 + local_13b8)) * (float)local_1488._0_4_ +
                            (fVar229 * fVar160 - (fVar228 + (float)local_13c8) * local_1438) *
                            (float)local_1478._0_4_ +
                            ((fVar216 + local_13b8) * local_1438 - fVar160 * fVar211) * fStack_12bc;
                  fVar217 = (fVar212 * (fVar205 + local_13c8._4_4_) -
                            fVar230 * (fVar217 + fStack_13b4)) * (float)local_1488._4_4_ +
                            (fVar230 * fVar166 - (fVar205 + local_13c8._4_4_) * fStack_1434) *
                            (float)local_1478._4_4_ +
                            ((fVar217 + fStack_13b4) * fStack_1434 - fVar166 * fVar212) *
                            fStack_12bc;
                  auVar196._0_8_ = CONCAT44(fVar217,fVar216);
                  auVar196._8_4_ =
                       (fVar213 * (fVar231 + fStack_13c0) - fStack_12e0 * (fVar218 + fStack_13b0)) *
                       fStack_1480 +
                       (fStack_12e0 * fVar167 - (fVar231 + fStack_13c0) * fStack_1430) * fStack_1470
                       + ((fVar218 + fStack_13b0) * fStack_1430 - fVar167 * fVar213) * fStack_12bc;
                  auVar196._12_4_ =
                       (fVar214 * (fVar232 + fStack_13bc) - fStack_12dc * (fVar219 + fStack_13ac)) *
                       fStack_147c +
                       (fStack_12dc * fVar203 - (fVar232 + fStack_13bc) * fStack_142c) * fStack_146c
                       + ((fVar219 + fStack_13ac) * fStack_142c - fVar203 * fVar214) * fStack_12bc;
                  fVar231 = (float)local_13a8 - (float)local_1418._0_4_;
                  fVar218 = local_13a8._4_4_ - (float)local_1418._4_4_;
                  fVar219 = fStack_13a0 - fStack_1410;
                  fVar215 = fStack_139c - fStack_140c;
                  auVar206._0_4_ =
                       (fVar184 * (fVar65 + (float)local_13c8) - fVar221 * (fVar139 + local_13b8)) *
                       (float)local_1488._0_4_ +
                       (fVar221 * ((float)local_1418._0_4_ + (float)local_13a8) -
                       (fVar65 + (float)local_13c8) * fVar231) * (float)local_1478._0_4_ +
                       ((fVar139 + local_13b8) * fVar231 -
                       ((float)local_1418._0_4_ + (float)local_13a8) * fVar184) * fStack_12bc;
                  auVar206._4_4_ =
                       (fVar185 * (fVar168 + local_13c8._4_4_) - fVar223 * (fVar157 + fStack_13b4))
                       * (float)local_1488._4_4_ +
                       (fVar223 * ((float)local_1418._4_4_ + local_13a8._4_4_) -
                       (fVar168 + local_13c8._4_4_) * fVar218) * (float)local_1478._4_4_ +
                       ((fVar157 + fStack_13b4) * fVar218 -
                       ((float)local_1418._4_4_ + local_13a8._4_4_) * fVar185) * fStack_12bc;
                  auVar206._8_4_ =
                       (fVar209 * (fVar197 + fStack_13c0) - fVar225 * (fVar158 + fStack_13b0)) *
                       fStack_1480 +
                       (fVar225 * (fStack_1410 + fStack_13a0) - (fVar197 + fStack_13c0) * fVar219) *
                       fStack_1470 +
                       ((fVar158 + fStack_13b0) * fVar219 - (fStack_1410 + fStack_13a0) * fVar209) *
                       fStack_12bc;
                  auVar206._12_4_ =
                       (fVar210 * (fVar103 + fStack_13bc) - fVar227 * (fVar159 + fStack_13ac)) *
                       fStack_147c +
                       (fVar227 * (fStack_140c + fStack_139c) - (fVar103 + fStack_13bc) * fVar215) *
                       fStack_146c +
                       ((fVar159 + fStack_13ac) * fVar215 - (fStack_140c + fStack_139c) * fVar210) *
                       fStack_12bc;
                  local_1418._4_4_ = fVar222;
                  local_1418._0_4_ = fVar220;
                  fStack_1410 = fVar224;
                  fStack_140c = fVar226;
                  auVar86._0_4_ =
                       (local_1428 * (float)local_1318._0_4_ - fVar220 * (float)local_12f8._0_4_) *
                       (float)local_1488._0_4_ +
                       (fVar220 * (float)local_1308._0_4_ - (float)local_1318._0_4_ * fVar199) *
                       (float)local_1478._0_4_ +
                       ((float)local_12f8._0_4_ * fVar199 - (float)local_1308._0_4_ * local_1428) *
                       fStack_12bc;
                  auVar86._4_4_ =
                       (fStack_1424 * (float)local_1318._4_4_ - fVar222 * (float)local_12f8._4_4_) *
                       (float)local_1488._4_4_ +
                       (fVar222 * (float)local_1308._4_4_ - (float)local_1318._4_4_ * fVar176) *
                       (float)local_1478._4_4_ +
                       ((float)local_12f8._4_4_ * fVar176 - (float)local_1308._4_4_ * fStack_1424) *
                       fStack_12bc;
                  auVar86._8_4_ =
                       (fStack_1420 * fStack_1310 - fVar224 * fStack_12f0) * fStack_1480 +
                       (fVar224 * fStack_1300 - fStack_1310 * fVar104) * fStack_1470 +
                       (fStack_12f0 * fVar104 - fStack_1300 * fStack_1420) * fStack_12bc;
                  auVar86._12_4_ =
                       (fStack_141c * fStack_130c - fVar226 * fStack_12ec) * fStack_147c +
                       (fVar226 * fStack_12fc - fStack_130c * fVar177) * fStack_146c +
                       (fStack_12ec * fVar177 - fStack_12fc * fStack_141c) * fStack_12bc;
                  local_1418._0_4_ = fVar216 + auVar206._0_4_ + auVar86._0_4_;
                  local_1418._4_4_ = fVar217 + auVar206._4_4_ + auVar86._4_4_;
                  fStack_1410 = auVar196._8_4_ + auVar206._8_4_ + auVar86._8_4_;
                  fStack_140c = auVar196._12_4_ + auVar206._12_4_ + auVar86._12_4_;
                  uVar40 = CONCAT44(local_1418._4_4_,local_1418._0_4_);
                  local_1318 = (undefined1  [8])(uVar40 & 0x7fffffff7fffffff);
                  fStack_1310 = ABS(fStack_1410);
                  fStack_130c = ABS(fStack_140c);
                  auVar179._8_4_ = auVar196._8_4_;
                  auVar179._0_8_ = auVar196._0_8_;
                  auVar179._12_4_ = auVar196._12_4_;
                  auVar140 = minps(auVar179,auVar206);
                  auVar172 = minps(auVar140,auVar86);
                  _local_12f8 = auVar196;
                  auVar128._8_4_ = auVar196._8_4_;
                  auVar128._0_8_ = auVar196._0_8_;
                  auVar128._12_4_ = auVar196._12_4_;
                  _local_1308 = auVar206;
                  auVar140 = maxps(auVar128,auVar206);
                  auVar105 = maxps(auVar140,auVar86);
                  auVar140 = _local_1318;
                  auVar129._4_4_ =
                       -(uint)(auVar105._4_4_ <= ABS((float)local_1418._4_4_) * 1.1920929e-07);
                  auVar129._0_4_ =
                       -(uint)(auVar105._0_4_ <= ABS((float)local_1418._0_4_) * 1.1920929e-07);
                  auVar129._8_4_ = -(uint)(auVar105._8_4_ <= fStack_1310 * 1.1920929e-07);
                  auVar129._12_4_ = -(uint)(auVar105._12_4_ <= fStack_130c * 1.1920929e-07);
                  auVar180._4_4_ =
                       -(uint)(-(ABS((float)local_1418._4_4_) * 1.1920929e-07) <= auVar172._4_4_);
                  auVar180._0_4_ =
                       -(uint)(-(ABS((float)local_1418._0_4_) * 1.1920929e-07) <= auVar172._0_4_);
                  auVar180._8_4_ = -(uint)(-(fStack_1310 * 1.1920929e-07) <= auVar172._8_4_);
                  auVar180._12_4_ = -(uint)(-(fStack_130c * 1.1920929e-07) <= auVar172._12_4_);
                  auVar129 = auVar129 | auVar180;
                  auVar130._0_4_ = auVar129._0_4_ & local_1118;
                  auVar130._4_4_ = auVar129._4_4_ & uStack_1114;
                  auVar130._8_4_ = auVar129._8_4_ & uStack_1110;
                  auVar130._12_4_ = auVar129._12_4_ & uStack_110c;
                  iVar38 = movmskps((int)pSVar36,auVar130);
                  uVar40 = local_1160;
                  uVar41 = local_1178;
                  uVar44 = local_1158;
                  uVar45 = local_1168;
                  uVar46 = local_1170;
                  auVar194 = local_1048;
                  fVar232 = local_10b8;
                  fVar119 = fStack_10b4;
                  fVar136 = fStack_10b0;
                  fVar160 = fStack_10ac;
                  fVar137 = local_10c8;
                  fVar138 = fStack_10c4;
                  fVar139 = fStack_10c0;
                  fVar166 = fStack_10bc;
                  fVar157 = local_10d8;
                  fVar158 = fStack_10d4;
                  fVar159 = fStack_10d0;
                  fVar168 = fStack_10cc;
                  fVar203 = local_1368;
                  fVar228 = fStack_1364;
                  fVar65 = fStack_1360;
                  fVar167 = fStack_135c;
                  fVar186 = local_10a8;
                  fVar187 = fStack_10a4;
                  fVar191 = fStack_10a0;
                  fVar205 = fStack_109c;
                  fVar192 = local_10f8;
                  fVar193 = fStack_10f4;
                  fVar198 = fStack_10f0;
                  fVar197 = fStack_10ec;
                  fVar204 = local_10e8;
                  fVar207 = fStack_10e4;
                  fVar208 = fStack_10e0;
                  fVar175 = fStack_10dc;
                  if (iVar38 != 0) {
                    uVar49 = -(uint)(ABS(fVar221 * local_1428) <= ABS(fVar229 * fVar184));
                    uVar59 = -(uint)(ABS(fVar223 * fStack_1424) <= ABS(fVar230 * fVar185));
                    uVar53 = -(uint)(ABS(fVar225 * fStack_1420) <= ABS(fStack_12e0 * fVar209));
                    uVar57 = -(uint)(ABS(fVar227 * fStack_141c) <= ABS(fStack_12dc * fVar210));
                    auVar189._0_4_ = fVar229 * fVar231 - local_1438 * fVar221;
                    auVar189._4_4_ = fVar230 * fVar218 - fStack_1434 * fVar223;
                    auVar189._8_4_ = fStack_12e0 * fVar219 - fStack_1430 * fVar225;
                    auVar189._12_4_ = fStack_12dc * fVar215 - fStack_142c * fVar227;
                    uVar51 = -(uint)(ABS(fVar231 * fVar220) <= ABS(local_1438 * fVar221));
                    uVar50 = -(uint)(ABS(fVar218 * fVar222) <= ABS(fStack_1434 * fVar223));
                    uVar54 = -(uint)(ABS(fVar219 * fVar224) <= ABS(fStack_1430 * fVar225));
                    uVar58 = -(uint)(ABS(fVar215 * fVar226) <= ABS(fStack_142c * fVar227));
                    uVar55 = -(uint)(ABS(fVar184 * fVar199) <= ABS(fVar211 * fVar231));
                    uVar52 = -(uint)(ABS(fVar185 * fVar176) <= ABS(fVar212 * fVar218));
                    uVar56 = -(uint)(ABS(fVar209 * fVar104) <= ABS(fVar213 * fVar219));
                    uVar60 = -(uint)(ABS(fVar210 * fVar177) <= ABS(fVar214 * fVar215));
                    local_1238[0] =
                         (float)(~uVar49 & (uint)(fVar211 * fVar221 - fVar229 * fVar184) |
                                (uint)(fVar184 * fVar220 - fVar221 * local_1428) & uVar49);
                    local_1238[1] =
                         (float)(~uVar59 & (uint)(fVar212 * fVar223 - fVar230 * fVar185) |
                                (uint)(fVar185 * fVar222 - fVar223 * fStack_1424) & uVar59);
                    local_1238[2] =
                         (float)(~uVar53 & (uint)(fVar213 * fVar225 - fStack_12e0 * fVar209) |
                                (uint)(fVar209 * fVar224 - fVar225 * fStack_1420) & uVar53);
                    local_1238[3] =
                         (float)(~uVar57 & (uint)(fVar214 * fVar227 - fStack_12dc * fVar210) |
                                (uint)(fVar210 * fVar226 - fVar227 * fStack_141c) & uVar57);
                    auVar181._0_4_ = ~uVar51 & (uint)auVar189._0_4_;
                    auVar181._4_4_ = ~uVar50 & (uint)auVar189._4_4_;
                    auVar181._8_4_ = ~uVar54 & (uint)auVar189._8_4_;
                    auVar181._12_4_ = ~uVar58 & (uint)auVar189._12_4_;
                    auVar17._4_4_ = (uint)(fVar223 * fVar176 - fVar218 * fVar222) & uVar50;
                    auVar17._0_4_ = (uint)(fVar221 * fVar199 - fVar231 * fVar220) & uVar51;
                    auVar17._8_4_ = (uint)(fVar225 * fVar104 - fVar219 * fVar224) & uVar54;
                    auVar17._12_4_ = (uint)(fVar227 * fVar177 - fVar215 * fVar226) & uVar58;
                    _local_1228 = auVar181 | auVar17;
                    local_1218[0] =
                         (float)(~uVar55 & (uint)(local_1438 * fVar184 - fVar211 * fVar231) |
                                (uint)(fVar231 * local_1428 - fVar184 * fVar199) & uVar55);
                    local_1218[1] =
                         (float)(~uVar52 & (uint)(fStack_1434 * fVar185 - fVar212 * fVar218) |
                                (uint)(fVar218 * fStack_1424 - fVar185 * fVar176) & uVar52);
                    local_1218[2] =
                         (float)(~uVar56 & (uint)(fStack_1430 * fVar209 - fVar213 * fVar219) |
                                (uint)(fVar219 * fStack_1420 - fVar209 * fVar104) & uVar56);
                    local_1218[3] =
                         (float)(~uVar60 & (uint)(fStack_142c * fVar210 - fVar214 * fVar215) |
                                (uint)(fVar215 * fStack_141c - fVar210 * fVar177) & uVar60);
                    fVar199 = (float)local_1488._0_4_ * local_1238[0] +
                              (float)local_1478._0_4_ * local_1228._0_4_ +
                              fStack_12bc * local_1218[0];
                    fVar176 = (float)local_1488._4_4_ * local_1238[1] +
                              (float)local_1478._4_4_ * local_1228._4_4_ +
                              fStack_12bc * local_1218[1];
                    fVar231 = fStack_1480 * local_1238[2] +
                              fStack_1470 * local_1228._8_4_ + fStack_12bc * local_1218[2];
                    fVar103 = fStack_147c * local_1238[3] +
                              fStack_146c * local_1228._12_4_ + fStack_12bc * local_1218[3];
                    auVar200._0_4_ = fVar199 + fVar199;
                    auVar200._4_4_ = fVar176 + fVar176;
                    auVar200._8_4_ = fVar231 + fVar231;
                    auVar200._12_4_ = fVar103 + fVar103;
                    auVar87._0_4_ = (float)local_13c8 * local_1218[0];
                    auVar87._4_4_ = local_13c8._4_4_ * local_1218[1];
                    auVar87._8_4_ = fStack_13c0 * local_1218[2];
                    auVar87._12_4_ = fStack_13bc * local_1218[3];
                    fVar104 = (float)local_13a8 * local_1238[0] +
                              local_13b8 * local_1228._0_4_ + auVar87._0_4_;
                    fVar177 = local_13a8._4_4_ * local_1238[1] +
                              fStack_13b4 * local_1228._4_4_ + auVar87._4_4_;
                    fVar184 = fStack_13a0 * local_1238[2] +
                              fStack_13b0 * local_1228._8_4_ + auVar87._8_4_;
                    fVar185 = fStack_139c * local_1238[3] +
                              fStack_13ac * local_1228._12_4_ + auVar87._12_4_;
                    auVar105 = rcpps(auVar87,auVar200);
                    fVar199 = auVar105._0_4_;
                    fVar176 = auVar105._4_4_;
                    fVar231 = auVar105._8_4_;
                    fVar103 = auVar105._12_4_;
                    auVar153._0_4_ =
                         ((1.0 - auVar200._0_4_ * fVar199) * fVar199 + fVar199) *
                         (fVar104 + fVar104);
                    auVar153._4_4_ =
                         ((1.0 - auVar200._4_4_ * fVar176) * fVar176 + fVar176) *
                         (fVar177 + fVar177);
                    auVar153._8_4_ =
                         ((1.0 - auVar200._8_4_ * fVar231) * fVar231 + fVar231) *
                         (fVar184 + fVar184);
                    auVar153._12_4_ =
                         ((1.0 - auVar200._12_4_ * fVar103) * fVar103 + fVar103) *
                         (fVar185 + fVar185);
                    fVar199 = (ray->super_RayK<1>).tfar;
                    uVar49 = (ray->super_RayK<1>).mask;
                    fVar176 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar201._0_4_ =
                         (int)((uint)(auVar200._0_4_ != 0.0 &&
                                     (auVar153._0_4_ <= fVar199 && fVar176 <= auVar153._0_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar201._4_4_ =
                         (int)((uint)(auVar200._4_4_ != 0.0 &&
                                     (auVar153._4_4_ <= fVar199 && fVar176 <= auVar153._4_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar201._8_4_ =
                         (int)((uint)(auVar200._8_4_ != 0.0 &&
                                     (auVar153._8_4_ <= fVar199 && fVar176 <= auVar153._8_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar201._12_4_ =
                         (int)((uint)(auVar200._12_4_ != 0.0 &&
                                     (auVar153._12_4_ <= fVar199 && fVar176 <= auVar153._12_4_)) *
                              -0x80000000) >> 0x1f;
                    auVar202 = auVar201 & auVar130;
                    iVar38 = movmskps(iVar38,auVar202);
                    if (iVar38 != 0) {
                      local_1298 = _local_1418;
                      local_1288 = &local_148d;
                      local_1278 = auVar202;
                      _local_1248 = auVar153;
                      auVar131._4_12_ = auVar130._4_12_;
                      auVar131._0_4_ = (float)(int)(*(ushort *)(uVar39 + 8 + lVar42) - 1);
                      auVar182._4_4_ = auVar130._4_4_;
                      auVar182._0_4_ = auVar131._0_4_;
                      auVar182._8_4_ = auVar130._8_4_;
                      auVar182._12_4_ = auVar130._12_4_;
                      auVar105 = rcpss(auVar182,auVar131);
                      auVar190._4_12_ = auVar189._4_12_;
                      auVar190._0_4_ = (float)(int)(*(ushort *)(uVar39 + 10 + lVar42) - 1);
                      fStack_12ac = (2.0 - auVar131._0_4_ * auVar105._0_4_) * auVar105._0_4_;
                      auVar183._4_4_ = auVar189._4_4_;
                      auVar183._0_4_ = auVar190._0_4_;
                      auVar183._8_4_ = auVar189._8_4_;
                      auVar183._12_4_ = auVar189._12_4_;
                      auVar105 = rcpss(auVar183,auVar190);
                      fVar199 = (2.0 - auVar190._0_4_ * auVar105._0_4_) * auVar105._0_4_;
                      local_12b8._0_4_ =
                           fStack_12ac *
                           ((float)(int)local_1108 * (float)local_1418._0_4_ +
                           ((float)local_1418._0_4_ - fVar216));
                      local_12b8._4_4_ =
                           fStack_12ac *
                           ((float)((int)fStack_1104 + 1) * (float)local_1418._4_4_ +
                           ((float)local_1418._4_4_ - fVar217));
                      fStack_12b0 = fStack_12ac *
                                    ((float)((int)fStack_1100 + 1) * fStack_1410 +
                                    (fStack_1410 - auVar196._8_4_));
                      fStack_12ac = fStack_12ac *
                                    ((float)(int)fStack_10fc * fStack_140c +
                                    (fStack_140c - auVar196._12_4_));
                      auVar165._0_4_ =
                           (float)(int)local_12d8 * (float)local_1418._0_4_ +
                           ((float)local_1418._0_4_ - auVar206._0_4_);
                      auVar165._4_4_ =
                           (float)(int)fStack_12d4 * (float)local_1418._4_4_ +
                           ((float)local_1418._4_4_ - auVar206._4_4_);
                      auVar165._8_4_ =
                           (float)((int)fStack_12d0 + 1) * fStack_1410 +
                           (fStack_1410 - auVar206._8_4_);
                      auVar165._12_4_ =
                           (float)((int)fStack_12cc + 1) * fStack_140c +
                           (fStack_140c - auVar206._12_4_);
                      local_12a8._0_4_ = fVar199 * auVar165._0_4_;
                      local_12a8._4_4_ = fVar199 * auVar165._4_4_;
                      fStack_12a0 = fVar199 * auVar165._8_4_;
                      fStack_129c = fVar199 * auVar165._12_4_;
                      pGVar10 = (context->scene->geometries).items[local_1458._0_8_].ptr;
                      if ((pGVar10->mask & uVar49) != 0) {
                        local_1408 = auVar202;
                        auVar105 = rcpps(auVar165,_local_1418);
                        fVar199 = auVar105._0_4_;
                        fVar176 = auVar105._4_4_;
                        fVar231 = auVar105._8_4_;
                        fVar103 = auVar105._12_4_;
                        local_1318._4_4_ = (undefined4)((ulong)local_1318 >> 0x20);
                        fVar199 = (float)(-(uint)(1e-18 <= (float)local_1318._0_4_) &
                                         (uint)(((float)DAT_01f7ba10 -
                                                (float)local_1418._0_4_ * fVar199) * fVar199 +
                                               fVar199));
                        fVar176 = (float)(-(uint)(1e-18 <= (float)local_1318._4_4_) &
                                         (uint)((DAT_01f7ba10._4_4_ -
                                                (float)local_1418._4_4_ * fVar176) * fVar176 +
                                               fVar176));
                        fVar231 = (float)(-(uint)(1e-18 <= fStack_1310) &
                                         (uint)((DAT_01f7ba10._8_4_ - fStack_1410 * fVar231) *
                                                fVar231 + fVar231));
                        fVar103 = (float)(-(uint)(1e-18 <= fStack_130c) &
                                         (uint)((DAT_01f7ba10._12_4_ - fStack_140c * fVar103) *
                                                fVar103 + fVar103));
                        auVar88._0_4_ = (float)local_12b8._0_4_ * fVar199;
                        auVar88._4_4_ = (float)local_12b8._4_4_ * fVar176;
                        auVar88._8_4_ = fStack_12b0 * fVar231;
                        auVar88._12_4_ = fStack_12ac * fVar103;
                        local_1268 = minps(auVar88,_DAT_01f7ba10);
                        auVar132._0_4_ = (float)local_12a8._0_4_ * fVar199;
                        auVar132._4_4_ = (float)local_12a8._4_4_ * fVar176;
                        auVar132._8_4_ = fStack_12a0 * fVar231;
                        auVar132._12_4_ = fStack_129c * fVar103;
                        local_1258 = minps(auVar132,_DAT_01f7ba10);
                        uVar51 = auVar202._0_4_;
                        auVar154._0_4_ = (uint)auVar153._0_4_ & uVar51;
                        uVar55 = auVar202._4_4_;
                        auVar154._4_4_ = (uint)auVar153._4_4_ & uVar55;
                        uVar59 = auVar202._8_4_;
                        auVar154._8_4_ = (uint)auVar153._8_4_ & uVar59;
                        uVar50 = auVar202._12_4_;
                        auVar154._12_4_ = (uint)auVar153._12_4_ & uVar50;
                        auVar112._0_8_ = CONCAT44(~uVar55,~uVar51) & 0x7f8000007f800000;
                        auVar112._8_4_ = ~uVar59 & 0x7f800000;
                        auVar112._12_4_ = ~uVar50 & 0x7f800000;
                        auVar112 = auVar112 | auVar154;
                        auVar133._4_4_ = auVar112._0_4_;
                        auVar133._0_4_ = auVar112._4_4_;
                        auVar133._8_4_ = auVar112._12_4_;
                        auVar133._12_4_ = auVar112._8_4_;
                        auVar105 = minps(auVar133,auVar112);
                        auVar89._0_8_ = auVar105._8_8_;
                        auVar89._8_4_ = auVar105._0_4_;
                        auVar89._12_4_ = auVar105._4_4_;
                        auVar105 = minps(auVar89,auVar105);
                        auVar90._0_8_ =
                             CONCAT44(-(uint)(auVar105._4_4_ == auVar112._4_4_) & uVar55,
                                      -(uint)(auVar105._0_4_ == auVar112._0_4_) & uVar51);
                        auVar90._8_4_ = -(uint)(auVar105._8_4_ == auVar112._8_4_) & uVar59;
                        auVar90._12_4_ = -(uint)(auVar105._12_4_ == auVar112._12_4_) & uVar50;
                        iVar38 = movmskps(uVar49,auVar90);
                        if (iVar38 != 0) {
                          auVar202._8_4_ = auVar90._8_4_;
                          auVar202._0_8_ = auVar90._0_8_;
                          auVar202._12_4_ = auVar90._12_4_;
                        }
                        uVar49 = movmskps(iVar38,auVar202);
                        lVar35 = 0;
                        if (uVar49 != 0) {
                          for (; (uVar49 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                          }
                        }
                        pRVar13 = local_1468->args;
                        if (pRVar13->filter == (RTCFilterFunctionN)0x0) {
                          pRVar47 = local_1468->user;
                          if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                            fVar199 = *(float *)(local_1268 + lVar35 * 4);
                            fVar176 = *(float *)(local_1258 + lVar35 * 4);
                            fVar231 = local_1238[lVar35];
                            fVar103 = local_1218[lVar35 + -4];
                            fVar104 = local_1218[lVar35];
                            (ray->super_RayK<1>).tfar = local_1238[lVar35 + -4];
                            (ray->Ng).field_0.field_0.x = fVar231;
                            (ray->Ng).field_0.field_0.y = fVar103;
                            (ray->Ng).field_0.field_0.z = fVar104;
                            ray->u = fVar199;
                            ray->v = fVar176;
                            ray->primID = (uint)local_1460;
                            ray->geomID = local_1458._0_4_;
                            ray->instID[0] = pRVar47->instID[0];
                            ray->instPrimID[0] = pRVar47->instPrimID[0];
                            context = local_1468;
                            goto LAB_00d2aa5a;
                          }
                        }
                        else {
                          pRVar47 = local_1468->user;
                        }
                        uVar29 = (ray->super_RayK<1>).tfar;
                        uVar30 = (ray->super_RayK<1>).mask;
                        uVar31 = (ray->super_RayK<1>).id;
                        fStack_1480 = (float)uVar31;
                        local_1488._4_4_ = uVar30;
                        local_1488._0_4_ = uVar29;
                        fStack_147c = (float)(ray->super_RayK<1>).flags;
                        _local_1478 = auVar153;
                        _local_1318 = auVar140;
                        local_12c8 = fStack_12bc;
                        fStack_12c4 = fStack_12bc;
                        fStack_12c0 = fStack_12bc;
                        while( true ) {
                          local_138c = *(undefined4 *)(local_1268 + lVar35 * 4);
                          local_1388 = *(undefined4 *)(local_1258 + lVar35 * 4);
                          (ray->super_RayK<1>).tfar = local_1238[lVar35 + -4];
                          local_1398 = local_1238[lVar35];
                          local_1394 = local_1218[lVar35 + -4];
                          local_1390 = local_1218[lVar35];
                          local_1384 = (int)local_1460;
                          local_1380 = local_1458._0_4_;
                          local_137c = pRVar47->instID[0];
                          local_1378 = pRVar47->instPrimID[0];
                          local_148c = (undefined1  [4])0xffffffff;
                          local_13f8.valid = (int *)local_148c;
                          local_13f8.geometryUserPtr = pGVar10->userPtr;
                          local_13f8.context = pRVar47;
                          local_13f8.ray = (RTCRayN *)ray;
                          local_13f8.hit = (RTCHitN *)&local_1398;
                          local_13f8.N = 1;
                          if (((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                              ((*pGVar10->intersectionFilterN)(&local_13f8), auVar153 = _local_1478,
                              (((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] != 0.0)) &&
                             ((pRVar13->filter == (RTCFilterFunctionN)0x0 ||
                              ((((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                 RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                (((pGVar10->field_8).field_0x2 & 0x40) == 0)) ||
                               ((*pRVar13->filter)(&local_13f8), auVar153 = _local_1478,
                               (((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] != 0.0)))))) {
                            (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.x =
                                 *(float *)local_13f8.hit;
                            (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_13f8.hit + 4);
                            (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_13f8.hit + 8);
                            *(float *)((long)local_13f8.ray + 0x3c) =
                                 *(float *)(local_13f8.hit + 0xc);
                            *(float *)((long)local_13f8.ray + 0x40) =
                                 *(float *)(local_13f8.hit + 0x10);
                            *(float *)((long)local_13f8.ray + 0x44) =
                                 *(float *)(local_13f8.hit + 0x14);
                            *(float *)((long)local_13f8.ray + 0x48) =
                                 *(float *)(local_13f8.hit + 0x18);
                            *(float *)((long)local_13f8.ray + 0x4c) =
                                 *(float *)(local_13f8.hit + 0x1c);
                            *(float *)((long)local_13f8.ray + 0x50) =
                                 *(float *)(local_13f8.hit + 0x20);
                            pRVar37 = (RayHit *)local_13f8.ray;
                          }
                          else {
                            (ray->super_RayK<1>).tfar = (float)local_1488._0_4_;
                            pRVar37 = (RayHit *)local_13f8.valid;
                            auVar153 = _local_1478;
                          }
                          *(undefined4 *)(local_1408 + lVar35 * 4) = 0;
                          local_1488._0_4_ = (ray->super_RayK<1>).tfar;
                          local_1488._4_4_ = (ray->super_RayK<1>).mask;
                          fStack_1480 = (float)(ray->super_RayK<1>).id;
                          fStack_147c = (float)(ray->super_RayK<1>).flags;
                          auVar92._0_4_ =
                               -(uint)(auVar153._0_4_ <= (float)local_1488._0_4_) & local_1408._0_4_
                          ;
                          auVar92._4_4_ =
                               -(uint)(auVar153._4_4_ <= (float)local_1488._0_4_) & local_1408._4_4_
                          ;
                          auVar92._8_4_ =
                               -(uint)(auVar153._8_4_ <= (float)local_1488._0_4_) & local_1408._8_4_
                          ;
                          auVar92._12_4_ =
                               -(uint)(auVar153._12_4_ <= (float)local_1488._0_4_) &
                               local_1408._12_4_;
                          local_1408 = auVar92;
                          iVar38 = movmskps((int)pRVar37,auVar92);
                          context = local_1468;
                          uVar40 = local_1160;
                          uVar41 = local_1178;
                          uVar44 = local_1158;
                          uVar45 = local_1168;
                          uVar46 = local_1170;
                          auVar194 = local_1048;
                          fVar232 = local_10b8;
                          fVar119 = fStack_10b4;
                          fVar136 = fStack_10b0;
                          fVar160 = fStack_10ac;
                          fVar137 = local_10c8;
                          fVar138 = fStack_10c4;
                          fVar139 = fStack_10c0;
                          fVar166 = fStack_10bc;
                          fVar157 = local_10d8;
                          fVar158 = fStack_10d4;
                          fVar159 = fStack_10d0;
                          fVar168 = fStack_10cc;
                          fVar203 = local_1368;
                          fVar228 = fStack_1364;
                          fVar65 = fStack_1360;
                          fVar167 = fStack_135c;
                          fVar186 = local_10a8;
                          fVar187 = fStack_10a4;
                          fVar191 = fStack_10a0;
                          fVar205 = fStack_109c;
                          fVar192 = local_10f8;
                          fVar193 = fStack_10f4;
                          fVar198 = fStack_10f0;
                          fVar197 = fStack_10ec;
                          fVar204 = local_10e8;
                          fVar207 = fStack_10e4;
                          fVar208 = fStack_10e0;
                          fVar175 = fStack_10dc;
                          if (iVar38 == 0) break;
                          auVar116._0_4_ = auVar92._0_4_ & (uint)auVar153._0_4_;
                          auVar116._4_4_ = auVar92._4_4_ & (uint)auVar153._4_4_;
                          auVar116._8_4_ = auVar92._8_4_ & (uint)auVar153._8_4_;
                          auVar116._12_4_ = auVar92._12_4_ & (uint)auVar153._12_4_;
                          auVar135._0_8_ =
                               CONCAT44(~auVar92._4_4_,~auVar92._0_4_) & 0x7f8000007f800000;
                          auVar135._8_4_ = ~auVar92._8_4_ & 0x7f800000;
                          auVar135._12_4_ = ~auVar92._12_4_ & 0x7f800000;
                          auVar135 = auVar135 | auVar116;
                          auVar156._4_4_ = auVar135._0_4_;
                          auVar156._0_4_ = auVar135._4_4_;
                          auVar156._8_4_ = auVar135._12_4_;
                          auVar156._12_4_ = auVar135._8_4_;
                          auVar140 = minps(auVar156,auVar135);
                          auVar117._0_8_ = auVar140._8_8_;
                          auVar117._8_4_ = auVar140._0_4_;
                          auVar117._12_4_ = auVar140._4_4_;
                          auVar140 = minps(auVar117,auVar140);
                          auVar118._0_8_ =
                               CONCAT44(-(uint)(auVar140._4_4_ == auVar135._4_4_) & auVar92._4_4_,
                                        -(uint)(auVar140._0_4_ == auVar135._0_4_) & auVar92._0_4_);
                          auVar118._8_4_ = -(uint)(auVar140._8_4_ == auVar135._8_4_) & auVar92._8_4_
                          ;
                          auVar118._12_4_ =
                               -(uint)(auVar140._12_4_ == auVar135._12_4_) & auVar92._12_4_;
                          iVar38 = movmskps(iVar38,auVar118);
                          if (iVar38 != 0) {
                            auVar92._8_4_ = auVar118._8_4_;
                            auVar92._0_8_ = auVar118._0_8_;
                            auVar92._12_4_ = auVar118._12_4_;
                          }
                          uVar34 = movmskps(iVar38,auVar92);
                          uVar40 = CONCAT44((int)((ulong)pRVar37 >> 0x20),uVar34);
                          lVar35 = 0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_00d2aa5a:
                local_1148 = local_1148 & local_1148 - 1;
              } while (local_1148 != 0);
            }
            local_1180 = local_1180 + 1;
          } while (local_1180 != local_1188);
        }
        fVar199 = (ray->super_RayK<1>).tfar;
        auVar194._4_4_ = fVar199;
        auVar194._0_4_ = fVar199;
        auVar194._8_4_ = fVar199;
        auVar194._12_4_ = fVar199;
        auVar172 = local_1128;
        fVar177 = local_1138;
        fVar184 = fStack_1134;
        fVar185 = fStack_1130;
        fVar176 = fStack_112c;
        fVar199 = local_1208;
        fVar231 = fStack_1204;
        fVar103 = fStack_1200;
        fVar104 = fStack_11fc;
      }
    } while (local_11c0 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }